

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void rollback_secondary_kvs(void)

{
  fdb_encryption_key *__s;
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  undefined8 doc;
  hbtrie **pphVar4;
  fdb_status fVar5;
  int iVar6;
  fdb_status fVar7;
  fdb_status extraout_EAX;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  fdb_file_handle **ptr_fhandle;
  fdb_doc *fconfig_00;
  fdb_kvs_config *config;
  fdb_config *pfVar11;
  fdb_kvs_handle *pfVar12;
  __atomic_base<unsigned_long> handle;
  __atomic_base<unsigned_long> doc_00;
  char *handle_00;
  fdb_iterator *doc_01;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *pfVar14;
  char *pcVar15;
  btree *extraout_RDX;
  char *pcVar16;
  fdb_kvs_handle *pfVar17;
  long lVar18;
  hbtrie **seqnum;
  fdb_kvs_handle *doc_02;
  char cVar19;
  uint uVar20;
  size_t unaff_RBP;
  fdb_doc *__s_00;
  undefined4 uVar21;
  fdb_kvs_handle *pfVar22;
  fdb_file_handle *fhandle;
  fdb_iterator *pfVar23;
  fdb_kvs_handle *unaff_R12;
  char *unaff_R13;
  ulong uVar24;
  fdb_doc *pfVar25;
  fdb_doc **ppfVar26;
  fdb_doc *pfVar27;
  char *pcVar28;
  btree *__s_01;
  char *pcVar29;
  fdb_iterator *config_00;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *kv1;
  fdb_kvs_handle *kv2;
  size_t valuelen_out;
  void *value_out;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_doc *pfStack_3180;
  fdb_iterator *pfStack_3178;
  int iStack_316c;
  fdb_kvs_handle *pfStack_3168;
  timeval tStack_3160;
  fdb_kvs_handle *pfStack_3150;
  fdb_kvs_handle *pfStack_3148;
  fdb_kvs_handle *pfStack_3140;
  fdb_kvs_handle *pfStack_3138;
  fdb_iterator *pfStack_3130;
  fdb_iterator *pfStack_3128;
  fdb_kvs_handle *pfStack_3118;
  fdb_kvs_handle *pfStack_3110;
  undefined1 auStack_3108 [24];
  fdb_kvs_handle *pfStack_30f0;
  fdb_kvs_handle *pfStack_30e8;
  fdb_kvs_handle *pfStack_30e0;
  fdb_kvs_handle *pfStack_30d8;
  undefined1 auStack_30d0 [80];
  undefined8 auStack_3080 [5];
  fdb_doc *apfStack_3058 [6];
  fdb_kvs_info fStack_3028;
  timeval tStack_2ff8;
  undefined1 auStack_2fe8 [280];
  fdb_iterator fStack_2ed0;
  fdb_kvs_handle fStack_2dd0;
  fdb_kvs_handle *pfStack_2bc8;
  btree *pbStack_2bc0;
  fdb_kvs_handle *pfStack_2bb8;
  code *pcStack_2bb0;
  fdb_iterator *pfStack_2ba0;
  fdb_kvs_handle *pfStack_2b98;
  fdb_kvs_handle *pfStack_2b90;
  fdb_kvs_handle *pfStack_2b88;
  fdb_custom_cmp_variable *pp_Stack_2b80;
  size_t sStack_2b78;
  fdb_kvs_handle *pfStack_2b70;
  fdb_kvs_info fStack_2b68;
  undefined1 auStack_2b38 [14];
  undefined2 uStack_2b2a;
  undefined1 auStack_2b28 [520];
  fdb_kvs_handle *pfStack_2920;
  fdb_kvs_handle *pfStack_2918;
  fdb_kvs_handle *pfStack_2910;
  fdb_kvs_handle *pfStack_2908;
  fdb_kvs_handle *pfStack_2900;
  fdb_kvs_handle *pfStack_28f8;
  undefined1 auStack_28e8 [8];
  fdb_file_handle *pfStack_28e0;
  fdb_kvs_handle *pfStack_28d8;
  fdb_kvs_handle *pfStack_28d0;
  fdb_iterator *pfStack_28c8;
  undefined1 auStack_28c0 [48];
  undefined1 auStack_2890 [64];
  hbtrie *phStack_2850;
  kvs_ops_stat *pkStack_2848;
  timeval tStack_2820;
  btreeblk_handle *apbStack_2810 [33];
  undefined1 auStack_2708 [32];
  undefined2 uStack_26e8;
  undefined1 uStack_26c8;
  code *pcStack_26b0;
  undefined4 uStack_26a8;
  fdb_txn *pfStack_26a0;
  fdb_kvs_handle *pfStack_2610;
  char acStack_2608 [256];
  fdb_kvs_handle *pfStack_2508;
  fdb_kvs_handle *pfStack_2500;
  fdb_kvs_handle *pfStack_24f8;
  fdb_kvs_handle *pfStack_24f0;
  fdb_kvs_handle *pfStack_24e8;
  fdb_kvs_handle *pfStack_24e0;
  fdb_kvs_handle *pfStack_24d0;
  uint uStack_24c4;
  fdb_iterator *pfStack_24c0;
  fdb_kvs_handle *pfStack_24b8;
  undefined4 *puStack_24b0;
  fdb_kvs_handle *pfStack_24a8;
  fdb_kvs_handle *pfStack_24a0;
  fdb_iterator *pfStack_2498;
  fdb_file_handle *pfStack_2490;
  fdb_iterator *pfStack_2488;
  size_t sStack_2480;
  undefined1 auStack_2478 [32];
  timeval tStack_2458;
  undefined1 auStack_2448 [272];
  size_t sStack_2338;
  char *pcStack_2330;
  uint8_t uStack_2328;
  undefined2 uStack_2320;
  undefined1 uStack_2300;
  fdb_kvs_handle *pfStack_2248;
  char acStack_2240 [256];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_2140;
  fdb_kvs_handle *pfStack_2138;
  fdb_kvs_handle *pfStack_2130;
  fdb_kvs_handle *pfStack_2128;
  fdb_kvs_handle *pfStack_2120;
  fdb_kvs_handle *pfStack_2118;
  fdb_kvs_handle *pfStack_2108;
  fdb_file_handle *pfStack_2100;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_20f8;
  fdb_doc *pfStack_20f0;
  fdb_kvs_handle *pfStack_20e8;
  fdb_kvs_handle *pfStack_20e0;
  fdb_kvs_handle *pfStack_20d8;
  fdb_kvs_handle *pfStack_20d0;
  fdb_kvs_handle *pfStack_20c8;
  fdb_kvs_handle *pfStack_20c0;
  fdb_kvs_config fStack_20b8;
  fdb_kvs_config fStack_20a0;
  fdb_kvs_config fStack_2080;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_2060 [4];
  timeval tStack_2040;
  fdb_config fStack_2030;
  fdb_kvs_info *pfStack_1f18;
  atomic<unsigned_long> aStack_1f10;
  fdb_kvs_handle *pfStack_1f08;
  atomic<unsigned_long> aStack_1f00;
  fdb_kvs_handle *pfStack_1ef8;
  atomic<unsigned_long> aStack_1ef0;
  fdb_kvs_handle *pfStack_1ee0;
  fdb_kvs_handle *pfStack_1ed8;
  fdb_file_handle *pfStack_1ed0;
  undefined1 auStack_1ec8 [16];
  fdb_config *pfStack_1eb8;
  fdb_kvs_info fStack_1eb0;
  fdb_kvs_config fStack_1e80;
  undefined1 auStack_1e68 [176];
  char acStack_1db8 [256];
  undefined1 auStack_1cb8 [512];
  fdb_config fStack_1ab8;
  fdb_kvs_handle *pfStack_19c0;
  fdb_kvs_handle *pfStack_19b8;
  fdb_kvs_handle *pfStack_19b0;
  fdb_kvs_handle *pfStack_19a8;
  fdb_kvs_handle *pfStack_19a0;
  fdb_kvs_handle *pfStack_1998;
  fdb_kvs_handle *pfStack_1990;
  fdb_kvs_handle *pfStack_1988;
  fdb_kvs_handle *pfStack_1980;
  fdb_kvs_handle *pfStack_1978;
  fdb_file_handle *pfStack_1970;
  undefined4 *puStack_1968;
  undefined1 auStack_1960 [48];
  fdb_kvs_handle *pfStack_1930;
  undefined1 auStack_1928 [40];
  undefined1 auStack_1900 [272];
  size_t sStack_17f0;
  uint8_t uStack_17e0;
  undefined1 uStack_17d8;
  undefined1 uStack_17b8;
  fdb_kvs_handle *pfStack_1700;
  char acStack_16f8 [256];
  hbtrie **pphStack_15f8;
  fdb_kvs_handle *pfStack_15f0;
  fdb_kvs_handle *pfStack_15e8;
  fdb_config *pfStack_15e0;
  fdb_kvs_handle *pfStack_15d8;
  fdb_kvs_handle *pfStack_15d0;
  fdb_kvs_handle *pfStack_15b8;
  hbtrie *phStack_15b0;
  undefined1 auStack_15a8 [16];
  hbtrie **pphStack_1598;
  kvs_info *apkStack_1590 [3];
  hbtrie *phStack_1578;
  timeval tStack_1570;
  undefined1 auStack_1560 [184];
  char acStack_14a8 [256];
  undefined1 auStack_13a8 [520];
  undefined8 uStack_11a0;
  undefined8 uStack_1198;
  undefined4 uStack_1184;
  undefined1 uStack_1179;
  fdb_doc *pfStack_10b0;
  fdb_kvs_handle *pfStack_10a8;
  fdb_kvs_handle *pfStack_10a0;
  fdb_doc *pfStack_1098;
  fdb_kvs_config *pfStack_1090;
  fdb_doc *pfStack_1088;
  fdb_kvs_handle *pfStack_1078;
  undefined1 auStack_1070 [16];
  fdb_kvs_handle *pfStack_1060;
  undefined1 auStack_1058 [24];
  fdb_doc *pfStack_1040;
  undefined1 auStack_1018 [64];
  fdb_doc *apfStack_fd8 [4];
  fdb_doc *pfStack_fb8;
  fdb_doc *apfStack_fb0 [5];
  fdb_doc *apfStack_f88 [5];
  timeval tStack_f60;
  char acStack_f50 [256];
  fdb_doc afStack_e50 [3];
  fdb_kvs_handle fStack_d50;
  fdb_kvs_handle *pfStack_b48;
  fdb_doc *pfStack_b40;
  fdb_file_handle **ppfStack_b38;
  code *pcStack_b30;
  undefined1 auStack_b20 [28];
  undefined4 uStack_b04;
  undefined1 auStack_b00 [104];
  timeval tStack_a98;
  fdb_file_info fStack_a88;
  fdb_config fStack_a40;
  char acStack_948 [256];
  fdb_kvs_handle fStack_848;
  fdb_kvs_handle **ppfStack_640;
  fdb_kvs_handle *pfStack_638;
  fdb_kvs_handle *pfStack_630;
  fdb_kvs_handle *pfStack_628;
  fdb_kvs_handle *pfStack_620;
  code *pcStack_618;
  fdb_kvs_handle *pfStack_600;
  fdb_kvs_handle *pfStack_5f8;
  fdb_doc *pfStack_5f0;
  undefined1 auStack_5e8 [24];
  hbtrie *phStack_5d0;
  undefined1 auStack_5c8 [32];
  timeval tStack_5a8;
  fdb_config fStack_598;
  undefined1 auStack_4a0 [512];
  fdb_kvs_handle *apfStack_2a0 [33];
  fdb_kvs_handle *pfStack_198;
  fdb_file_handle *local_168;
  fdb_kvs_handle *local_160;
  fdb_kvs_handle *local_158;
  size_t local_150;
  kvs_info *local_148;
  timeval local_140;
  fdb_kvs_config local_130;
  fdb_config local_118;
  
  gettimeofday(&local_140,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&local_168,"./mvcc_test1",&local_118);
  pfVar17 = (fdb_kvs_handle *)&local_160;
  fdb_kvs_open_default(local_168,(fdb_kvs_handle **)pfVar17,&local_130);
  fdb_kvs_open_default(local_168,&local_158,&local_130);
  pcVar15 = "val-a";
  fVar5 = fdb_set_kv(local_160,"a",1,"val-a",5);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pcVar15 = "val-b";
    fVar5 = fdb_set_kv(local_160,"b",1,"val-b",5);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010fce6;
    fdb_commit(local_168,'\x01');
    pcVar15 = "val-v";
    fVar5 = fdb_set_kv(local_160,"b",1,"val-v",5);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010fceb;
    fdb_commit(local_168,'\x01');
    fVar5 = fdb_del_kv(local_160,"a",1);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010fcf0;
    fdb_commit(local_168,'\x01');
    pfVar17 = (fdb_kvs_handle *)&local_148;
    pcVar15 = (char *)pfVar17;
    fVar5 = fdb_get_kv(local_158,"b",1,(void **)pfVar17,&local_150);
    unaff_RBP = (size_t)(uint)fVar5;
    free(local_148);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010fcf5;
    fVar5 = fdb_rollback(&local_158,3);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      fdb_close(local_168);
      fdb_shutdown();
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (rollback_secondary_kvs()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar15,"rollback secondary kv");
      return;
    }
  }
  else {
    rollback_secondary_kvs();
LAB_0010fce6:
    rollback_secondary_kvs();
LAB_0010fceb:
    rollback_secondary_kvs();
LAB_0010fcf0:
    rollback_secondary_kvs();
LAB_0010fcf5:
    rollback_secondary_kvs();
  }
  rollback_secondary_kvs();
  pcStack_618 = (code *)0x10fd1c;
  pfStack_198 = pfVar17;
  gettimeofday(&tStack_5a8,(__timezone_ptr_t)0x0);
  pcStack_618 = (code *)0x10fd21;
  memleak_start();
  pcStack_618 = (code *)0x10fd2d;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_618 = (code *)0x10fd3a;
  fdb_get_default_config();
  pfVar17 = (fdb_kvs_handle *)(auStack_5c8 + 8);
  pcStack_618 = (code *)0x10fd47;
  fdb_get_default_kvs_config();
  fStack_598.buffercache_size = 0x100000;
  fStack_598.wal_threshold = 0x400;
  fStack_598.flags = 1;
  fStack_598.compaction_threshold = '\0';
  pfVar12 = (fdb_kvs_handle *)&phStack_5d0;
  pcStack_618 = (code *)0x10fd79;
  fdb_open((fdb_file_handle **)pfVar12,"./mvcc_test1",&fStack_598);
  pcVar16 = (char *)&pfStack_5f8;
  pcStack_618 = (code *)0x10fd8c;
  fdb_kvs_open_default
            ((fdb_file_handle *)phStack_5d0,(fdb_kvs_handle **)pcVar16,(fdb_kvs_config *)pfVar17);
  pcStack_618 = (code *)0x10fda2;
  pfVar22 = pfStack_5f8;
  fVar5 = fdb_set_log_callback(pfStack_5f8,logCallbackFunc,"multi_version_test");
  uVar21 = SUB84(pfVar22,0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011033b;
  pcVar16 = (char *)apfStack_2a0;
  pcStack_618 = (code *)0x10fdc5;
  sprintf(pcVar16,"key%d",0);
  unaff_R12 = (fdb_kvs_handle *)(auStack_4a0 + 0x100);
  pcStack_618 = (code *)0x10fde0;
  sprintf((char *)unaff_R12,"meta%d",0);
  unaff_R13 = auStack_4a0;
  pcStack_618 = (code *)0x10fdfb;
  sprintf(unaff_R13,"body%d",0);
  pcStack_618 = (code *)0x10fe03;
  sVar8 = strlen(pcVar16);
  pcStack_618 = (code *)0x10fe0e;
  sVar9 = strlen((char *)unaff_R12);
  pcStack_618 = (code *)0x10fe19;
  sVar10 = strlen(unaff_R13);
  pfVar17 = (fdb_kvs_handle *)&pfStack_5f0;
  pcStack_618 = (code *)0x10fe39;
  fdb_doc_create((fdb_doc **)pfVar17,pcVar16,sVar8,unaff_R12,sVar9,unaff_R13,sVar10);
  pcStack_618 = (code *)0x10fe46;
  fdb_set(pfStack_5f8,pfStack_5f0);
  pcStack_618 = (code *)0x10fe5c;
  sprintf(pcVar16,"key%d",1);
  pcStack_618 = (code *)0x10fe72;
  sprintf((char *)unaff_R12,"meta%d",1);
  pcStack_618 = (code *)0x10fe88;
  sprintf(unaff_R13,"body%d",1);
  pcStack_618 = (code *)0x10fe90;
  sVar8 = strlen(pcVar16);
  pcStack_618 = (code *)0x10fe9b;
  unaff_RBP = strlen((char *)unaff_R12);
  pcStack_618 = (code *)0x10fea6;
  sVar9 = strlen(unaff_R13);
  pcStack_618 = (code *)0x10fec3;
  pcVar15 = (char *)unaff_R12;
  fdb_doc_create((fdb_doc **)auStack_5e8,pcVar16,sVar8,unaff_R12,unaff_RBP,unaff_R13,sVar9);
  pcStack_618 = (code *)0x10fed1;
  fdb_set(pfStack_5f8,(fdb_doc *)auStack_5e8._0_8_);
  pcStack_618 = (code *)0x10fee0;
  fdb_commit((fdb_file_handle *)phStack_5d0,'\x01');
  pcStack_618 = (code *)0x10fef9;
  fdb_open((fdb_file_handle **)auStack_5c8,"./mvcc_test1",&fStack_598);
  pfVar12 = (fdb_kvs_handle *)(auStack_5e8 + 0x10);
  pcStack_618 = (code *)0x10ff0e;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_5c8._0_8_,(fdb_kvs_handle **)pfVar12,
             (fdb_kvs_config *)(auStack_5c8 + 8));
  pcStack_618 = (code *)0x10ff24;
  pfVar22 = (fdb_kvs_handle *)auStack_5e8._16_8_;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_5e8._16_8_,logCallbackFunc,"multi_version_test");
  uVar21 = SUB84(pfVar22,0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110340;
  pcVar16 = "meta2%d";
  pcVar15 = auStack_4a0 + 0x100;
  pcStack_618 = (code *)0x10ff4a;
  sprintf(pcVar15,"meta2%d",0);
  pcStack_618 = (code *)0x10ff68;
  sprintf((char *)auStack_4a0,"body2%d",0);
  pcStack_618 = (code *)0x10ff70;
  sVar8 = strlen(pcVar15);
  pcStack_618 = (code *)0x10ff7b;
  sVar9 = strlen((char *)auStack_4a0);
  pcStack_618 = (code *)0x10ff8f;
  fdb_doc_update((fdb_doc **)pfVar17,pcVar15,sVar8,(fdb_kvs_handle *)auStack_4a0,sVar9);
  unaff_R13 = auStack_5e8;
  pcStack_618 = (code *)0x10ffa2;
  fdb_set(pfStack_5f8,pfStack_5f0);
  pcStack_618 = (code *)0x10ffb4;
  sprintf(pcVar15,"meta2%d",1);
  pcStack_618 = (code *)0x10ffc6;
  sprintf((char *)auStack_4a0,"body2%d",1);
  pcStack_618 = (code *)0x10ffce;
  sVar8 = strlen(pcVar15);
  pcStack_618 = (code *)0x10ffd9;
  sVar9 = strlen((char *)auStack_4a0);
  pcStack_618 = (code *)0x10ffed;
  fdb_doc_update((fdb_doc **)unaff_R13,pcVar15,sVar8,(fdb_kvs_handle *)auStack_4a0,sVar9);
  pcStack_618 = (code *)0x10fffb;
  fdb_set(pfStack_5f8,(fdb_doc *)auStack_5e8._0_8_);
  pcStack_618 = (code *)0x11000a;
  fdb_commit((fdb_file_handle *)phStack_5d0,'\x01');
  unaff_RBP = CONCAT71((int7)(sVar8 >> 8),1);
  pfVar12 = (fdb_kvs_handle *)auStack_4a0;
  do {
    pcVar15 = (char *)0x0;
    pcStack_618 = (code *)0x110034;
    fdb_doc_create((fdb_doc **)&pfStack_600,(void *)(*(size_t **)&pfVar17->kvs_config)[4],
                   **(size_t **)&pfVar17->kvs_config,(void *)0x0,0,(void *)0x0,0);
    pcStack_618 = (code *)0x110043;
    fVar5 = fdb_get(pfStack_5f8,(fdb_doc *)pfStack_600);
    unaff_R12 = pfStack_600;
    pfVar22 = (fdb_kvs_handle *)&pfStack_600;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      pcStack_618 = (code *)0x1102ef;
      multi_version_test();
LAB_001102ef:
      pcStack_618 = (code *)0x1102fa;
      multi_version_test();
      unaff_R12 = pfVar12;
LAB_001102fa:
      pcStack_618 = (code *)0x110305;
      multi_version_test();
      goto LAB_00110305;
    }
    unaff_R13 = (char *)pfStack_600->staletree;
    pcVar16 = *(char **)&pfVar17->kvs_config;
    pfVar17 = *(fdb_kvs_handle **)((long)pcVar16 + 0x38);
    pcStack_618 = (code *)0x11006c;
    iVar6 = bcmp(unaff_R13,pfVar17,(size_t)(pfStack_600->kvs_config).custom_cmp);
    pfVar12 = unaff_R12;
    if (iVar6 != 0) goto LAB_001102ef;
    pfVar17 = (fdb_kvs_handle *)(unaff_R12->field_6).seqtree;
    unaff_R13 = *(char **)((long)pcVar16 + 0x40);
    pcStack_618 = (code *)0x11008d;
    iVar6 = bcmp(pfVar17,unaff_R13,(size_t)(unaff_R12->kvs_config).custom_cmp_param);
    if (iVar6 != 0) goto LAB_001102fa;
    pcStack_618 = (code *)0x11009d;
    fdb_doc_free((fdb_doc *)unaff_R12);
    pfVar17 = (fdb_kvs_handle *)auStack_5e8;
    cVar19 = (char)unaff_RBP;
    unaff_RBP = 0;
  } while (cVar19 != '\0');
  unaff_R13 = (char *)&pfStack_5f0;
  unaff_RBP = 1;
  pfVar17 = (fdb_kvs_handle *)&pfStack_600;
  do {
    pcVar15 = (char *)0x0;
    pcStack_618 = (code *)0x1100e1;
    fdb_doc_create((fdb_doc **)pfVar17,
                   (void *)(*(size_t **)&((fdb_kvs_handle *)unaff_R13)->kvs_config)[4],
                   **(size_t **)&((fdb_kvs_handle *)unaff_R13)->kvs_config,(void *)0x0,0,(void *)0x0
                   ,0);
    pcStack_618 = (code *)0x1100f0;
    fVar5 = fdb_get((fdb_kvs_handle *)auStack_5e8._16_8_,(fdb_doc *)pfStack_600);
    pfVar13 = pfStack_600;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110305;
    unaff_R12 = (fdb_kvs_handle *)pfStack_600->staletree;
    pcVar16 = *(char **)&((fdb_kvs_handle *)unaff_R13)->kvs_config;
    unaff_R13 = *(char **)((long)pcVar16 + 0x38);
    pcStack_618 = (code *)0x110118;
    iVar6 = bcmp(unaff_R12,unaff_R13,(size_t)(pfStack_600->kvs_config).custom_cmp);
    if (iVar6 != 0) goto LAB_0011030a;
    unaff_R12 = (fdb_kvs_handle *)(pfVar13->field_6).seqtree;
    unaff_R13 = *(char **)((long)pcVar16 + 0x40);
    pcStack_618 = (code *)0x110137;
    iVar6 = bcmp(unaff_R12,unaff_R13,(size_t)(pfVar13->kvs_config).custom_cmp_param);
    if (iVar6 != 0) goto LAB_00110315;
    pcStack_618 = (code *)0x110147;
    fdb_doc_free((fdb_doc *)pfVar13);
    unaff_R13 = auStack_5e8;
    cVar19 = (char)unaff_RBP;
    unaff_RBP = 0;
    pfVar22 = pfVar13;
  } while (cVar19 != '\0');
  pfVar17 = (fdb_kvs_handle *)(auStack_5e8 + 0x10);
  pcStack_618 = (code *)0x110168;
  fdb_kvs_close((fdb_kvs_handle *)auStack_5e8._16_8_);
  pfVar12 = (fdb_kvs_handle *)auStack_5c8;
  pcStack_618 = (code *)0x110175;
  fdb_close((fdb_file_handle *)auStack_5c8._0_8_);
  pcStack_618 = (code *)0x110189;
  fdb_open((fdb_file_handle **)pfVar12,"./mvcc_test1",&fStack_598);
  pcStack_618 = (code *)0x110199;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_5c8._0_8_,(fdb_kvs_handle **)pfVar17,
             (fdb_kvs_config *)(auStack_5c8 + 8));
  pcStack_618 = (code *)0x1101af;
  pfVar22 = (fdb_kvs_handle *)auStack_5e8._16_8_;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_5e8._16_8_,logCallbackFunc,"multi_version_test");
  uVar21 = SUB84(pfVar22,0);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    unaff_R13 = (char *)&pfStack_5f0;
    unaff_RBP = 1;
    pfVar17 = (fdb_kvs_handle *)&pfStack_600;
    pfVar13 = pfVar12;
    while( true ) {
      pcVar15 = (char *)0x0;
      pcStack_618 = (code *)0x1101e7;
      fdb_doc_create((fdb_doc **)pfVar17,
                     (void *)(*(size_t **)&((fdb_kvs_handle *)unaff_R13)->kvs_config)[4],
                     **(size_t **)&((fdb_kvs_handle *)unaff_R13)->kvs_config,(void *)0x0,0,
                     (void *)0x0,0);
      pcStack_618 = (code *)0x1101f6;
      fVar5 = fdb_get((fdb_kvs_handle *)auStack_5e8._16_8_,(fdb_doc *)pfStack_600);
      pfVar12 = pfStack_600;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      unaff_R12 = (fdb_kvs_handle *)pfStack_600->staletree;
      pcVar16 = *(char **)&((fdb_kvs_handle *)unaff_R13)->kvs_config;
      unaff_R13 = *(char **)((long)pcVar16 + 0x38);
      pcStack_618 = (code *)0x11021e;
      iVar6 = bcmp(unaff_R12,unaff_R13,(size_t)(pfStack_600->kvs_config).custom_cmp);
      if (iVar6 != 0) goto LAB_00110325;
      unaff_R12 = (fdb_kvs_handle *)(pfVar12->field_6).seqtree;
      unaff_R13 = *(char **)((long)pcVar16 + 0x40);
      pcStack_618 = (code *)0x11023d;
      iVar6 = bcmp(unaff_R12,unaff_R13,(size_t)(pfVar12->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_00110330;
      pcStack_618 = (code *)0x11024d;
      fdb_doc_free((fdb_doc *)pfVar12);
      unaff_R13 = auStack_5e8;
      cVar19 = (char)unaff_RBP;
      unaff_RBP = 0;
      pfVar13 = pfVar12;
      if (cVar19 == '\0') {
        pcStack_618 = (code *)0x11026b;
        fdb_doc_free(pfStack_5f0);
        pcStack_618 = (code *)0x110275;
        fdb_doc_free((fdb_doc *)auStack_5e8._0_8_);
        pcStack_618 = (code *)0x11027f;
        fdb_kvs_close(pfStack_5f8);
        pcStack_618 = (code *)0x110289;
        fdb_kvs_close((fdb_kvs_handle *)auStack_5e8._16_8_);
        pcStack_618 = (code *)0x110293;
        fdb_close((fdb_file_handle *)phStack_5d0);
        pcStack_618 = (code *)0x11029d;
        fdb_close((fdb_file_handle *)auStack_5c8._0_8_);
        pcStack_618 = (code *)0x1102a2;
        fdb_shutdown();
        pcStack_618 = (code *)0x1102a7;
        memleak_end();
        pcVar15 = "%s PASSED\n";
        if (multi_version_test()::__test_pass != '\0') {
          pcVar15 = "%s FAILED\n";
        }
        pcStack_618 = (code *)0x1102d8;
        fprintf(_stderr,pcVar15,"multi version test");
        return;
      }
    }
    goto LAB_00110320;
  }
  goto LAB_00110345;
LAB_00111216:
  pfStack_1088 = (fdb_doc *)0x111221;
  snapshot_test();
  pfVar27 = fconfig_00;
LAB_00111221:
  fconfig_00 = pfVar27;
  pfStack_1088 = (fdb_doc *)0x111226;
  snapshot_test();
LAB_00111226:
  pfStack_1088 = (fdb_doc *)0x111231;
  snapshot_test();
LAB_00111231:
  pfVar25 = (fdb_doc *)auStack_1058;
  pfStack_1088 = (fdb_doc *)0x11123c;
  snapshot_test();
  goto LAB_0011123c;
LAB_00111b40:
  pfStack_1998 = (fdb_kvs_handle *)0x111b45;
  snapshot_with_uncomitted_data_test();
  pfVar17 = (fdb_kvs_handle *)pcVar28;
LAB_00111b45:
  pfStack_1998 = (fdb_kvs_handle *)0x111b4a;
  snapshot_with_uncomitted_data_test();
  goto LAB_00111b4a;
LAB_00113057:
  pfStack_24e0 = (fdb_kvs_handle *)0x11305c;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfVar12 = (fdb_kvs_handle *)pcVar29;
LAB_0011305c:
  pfStack_24e0 = (fdb_kvs_handle *)0x113061;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113061:
  pfStack_24e0 = (fdb_kvs_handle *)0x113071;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113071:
  pfStack_24e0 = (fdb_kvs_handle *)0x11307c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011307c:
  pfStack_24e0 = (fdb_kvs_handle *)0x11308c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011308c:
  pcVar29 = (char *)pfVar12;
  pfStack_24e0 = (fdb_kvs_handle *)0x113091;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113091:
  pfStack_24e0 = (fdb_kvs_handle *)0x1130a1;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130a1:
  pfStack_24e0 = (fdb_kvs_handle *)0x1130ac;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130ac:
  pfStack_24e0 = (fdb_kvs_handle *)0x1130b7;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130b7:
  pfStack_24e0 = (fdb_kvs_handle *)0x1130c7;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130c7:
  pfStack_24e0 = (fdb_kvs_handle *)0x1130d2;
  in_memory_snapshot_on_dirty_hbtrie_test();
  goto LAB_001130d2;
LAB_00113614:
  pfStack_28f8 = (fdb_kvs_handle *)0x113624;
  in_memory_snapshot_compaction_test();
LAB_00113624:
  pfStack_28f8 = (fdb_kvs_handle *)0x11362f;
  in_memory_snapshot_compaction_test();
LAB_0011362f:
  pfStack_28f8 = (fdb_kvs_handle *)0x11363f;
  in_memory_snapshot_compaction_test();
LAB_0011363f:
  pfStack_28f8 = (fdb_kvs_handle *)0x11364a;
  in_memory_snapshot_compaction_test();
  goto LAB_0011364a;
LAB_00113ba0:
  pcStack_2bb0 = (code *)0x113bb0;
  cb_inmem_snap();
LAB_00113bb0:
  pcStack_2bb0 = (code *)0x113bc0;
  cb_inmem_snap();
LAB_00113bc0:
  pcStack_2bb0 = (code *)0x113bd0;
  cb_inmem_snap();
LAB_00113bd0:
  pfVar14 = (fdb_kvs_handle *)(auStack_2b28 + 0x100);
  pfVar22 = (fdb_kvs_handle *)auStack_2b28;
  pcStack_2bb0 = (code *)0x113be0;
  cb_inmem_snap();
  goto LAB_00113be0;
LAB_00114672:
  pfStack_3128 = (fdb_iterator *)0x11467d;
  snapshot_clone_test();
  pfVar14 = pfVar13;
LAB_0011467d:
  pfVar13 = pfVar14;
  pfStack_3128 = (fdb_iterator *)0x114682;
  snapshot_clone_test();
LAB_00114682:
  pfStack_3128 = (fdb_iterator *)0x11468d;
  snapshot_clone_test();
LAB_0011468d:
  pfVar12 = (fdb_kvs_handle *)&pfStack_3110;
  pfStack_3128 = (fdb_iterator *)0x114698;
  snapshot_clone_test();
  goto LAB_00114698;
LAB_00110305:
  pfVar13 = pfVar22;
  pcStack_618 = (code *)0x11030a;
  multi_version_test();
LAB_0011030a:
  pcStack_618 = (code *)0x110315;
  multi_version_test();
LAB_00110315:
  pcStack_618 = (code *)0x110320;
  multi_version_test();
LAB_00110320:
  pfVar12 = pfVar13;
  pcStack_618 = (code *)0x110325;
  multi_version_test();
LAB_00110325:
  pcStack_618 = (code *)0x110330;
  multi_version_test();
LAB_00110330:
  pcStack_618 = (code *)0x11033b;
  pfVar22 = (fdb_kvs_handle *)unaff_R13;
  multi_version_test();
  uVar21 = SUB84(pfVar22,0);
LAB_0011033b:
  pcStack_618 = (code *)0x110340;
  multi_version_test();
LAB_00110340:
  pcStack_618 = (code *)0x110345;
  multi_version_test();
LAB_00110345:
  pcStack_618 = crash_recovery_test;
  multi_version_test();
  pcStack_b30 = (code *)0x11036e;
  uStack_b04 = uVar21;
  ppfStack_640 = (fdb_kvs_handle **)pcVar16;
  pfStack_638 = unaff_R12;
  pfStack_630 = (fdb_kvs_handle *)unaff_R13;
  pfStack_628 = pfVar17;
  pfStack_620 = pfVar12;
  pcStack_618 = (code *)unaff_RBP;
  gettimeofday(&tStack_a98,(__timezone_ptr_t)0x0);
  pcStack_b30 = (code *)0x110373;
  memleak_start();
  pcStack_b30 = (code *)0x11037f;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_b30 = (code *)0x11038f;
  fdb_get_default_config();
  pfVar25 = (fdb_doc *)auStack_b00;
  pcStack_b30 = (code *)0x11039c;
  fdb_get_default_kvs_config();
  fStack_a40.buffercache_size = 0;
  fStack_a40.seqtree_opt = '\x01';
  fStack_a40.wal_threshold = 0x400;
  fStack_a40.flags = 1;
  fStack_a40.compaction_threshold = '\0';
  ptr_fhandle = (fdb_file_handle **)(auStack_b20 + 8);
  pcStack_b30 = (code *)0x1103d2;
  fdb_open(ptr_fhandle,"./mvcc_test2",&fStack_a40);
  pfVar17 = (fdb_kvs_handle *)auStack_b20;
  pcStack_b30 = (code *)0x1103e5;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_b20._8_8_,(fdb_kvs_handle **)pfVar17,
             (fdb_kvs_config *)pfVar25);
  pcStack_b30 = (code *)0x1103fb;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_b20._0_8_,logCallbackFunc,"crash_recovery_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    unaff_R13 = (char *)0x0;
    uVar24 = 0;
    do {
      __s = &fStack_848.config.encryption_key;
      pcStack_b30 = (code *)0x110425;
      sprintf((char *)__s,"key%d",uVar24 & 0xffffffff);
      pcStack_b30 = (code *)0x11043e;
      sprintf((char *)&fStack_848,"meta%d",uVar24 & 0xffffffff);
      pcStack_b30 = (code *)0x110457;
      sprintf(acStack_948,"body%d",uVar24 & 0xffffffff);
      unaff_R12 = (fdb_kvs_handle *)(auStack_b00 + (long)unaff_R13 + 0x18);
      pcStack_b30 = (code *)0x110467;
      unaff_RBP = strlen((char *)__s);
      pfVar17 = &fStack_848;
      pcStack_b30 = (code *)0x11047a;
      ptr_fhandle = (fdb_file_handle **)strlen((char *)pfVar17);
      pcStack_b30 = (code *)0x11048a;
      sVar8 = strlen(acStack_948);
      pcStack_b30 = (code *)0x1104af;
      pcVar15 = (char *)pfVar17;
      fdb_doc_create((fdb_doc **)unaff_R12,&fStack_848.config.encryption_key,unaff_RBP,pfVar17,
                     (size_t)ptr_fhandle,acStack_948,sVar8);
      pcStack_b30 = (code *)0x1104be;
      fdb_set((fdb_kvs_handle *)auStack_b20._0_8_,*(fdb_doc **)(auStack_b00 + uVar24 * 8 + 0x18));
      uVar24 = uVar24 + 1;
      unaff_R13 = (char *)((long)unaff_R13 + 8);
    } while (uVar24 != 10);
    pfVar25 = (fdb_doc *)0xa;
    fhandle = (fdb_file_handle *)auStack_b20._8_8_;
    if ((char)uStack_b04 != '\0') {
      pcStack_b30 = (code *)0x1104e5;
      fVar5 = fdb_commit((fdb_file_handle *)auStack_b20._8_8_,'\x01');
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pcStack_b30 = (code *)0x1104ee;
        crash_recovery_test();
        goto LAB_001104ee;
      }
LAB_001104fd:
      pcStack_b30 = (code *)0x11050f;
      fVar5 = fdb_get_file_info((fdb_file_handle *)auStack_b20._8_8_,&fStack_a88);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110783;
      uVar24 = (ulong)fStack_a40.blocksize;
      pcStack_b30 = (code *)0x110538;
      fdb_kvs_close((fdb_kvs_handle *)auStack_b20._0_8_);
      pcStack_b30 = (code *)0x110542;
      fdb_close((fdb_file_handle *)auStack_b20._8_8_);
      pcStack_b30 = (code *)0x110547;
      fdb_shutdown();
      pfVar17 = (fdb_kvs_handle *)((fStack_a88.file_size / uVar24) * (ulong)fStack_a40.blocksize);
      pcVar15 = (char *)(ulong)(fStack_a40.blocksize >> 2);
      pcStack_b30 = (code *)0x110569;
      iVar6 = _disk_dump("./mvcc_test2",(size_t)pfVar17,
                         (ulong)((fStack_a40.blocksize >> 2) + fStack_a40.blocksize * 2));
      if (iVar6 < 0) goto LAB_00110788;
      pcStack_b30 = (code *)0x11058a;
      fVar5 = fdb_open((fdb_file_handle **)(auStack_b20 + 8),"./mvcc_test2",&fStack_a40);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011078d;
      pcStack_b30 = (code *)0x1105a6;
      fVar5 = fdb_kvs_open_default
                        ((fdb_file_handle *)auStack_b20._8_8_,(fdb_kvs_handle **)auStack_b20,
                         (fdb_kvs_config *)auStack_b00);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110792;
      pcStack_b30 = (code *)0x1105c6;
      fVar5 = fdb_set_log_callback
                        ((fdb_kvs_handle *)auStack_b20._0_8_,logCallbackFunc,"crash_recovery_test");
      if (fVar5 == FDB_RESULT_SUCCESS) {
        unaff_R13 = (char *)0x0;
        do {
          pcVar15 = (char *)0x0;
          pcStack_b30 = (code *)0x1105fa;
          fdb_doc_create((fdb_doc **)(auStack_b20 + 0x10),
                         (void *)(*(size_t **)(auStack_b00 + (long)unaff_R13 * 8 + 0x18))[4],
                         **(size_t **)(auStack_b00 + (long)unaff_R13 * 8 + 0x18),(void *)0x0,0,
                         (void *)0x0,0);
          pcStack_b30 = (code *)0x110609;
          fVar5 = fdb_get((fdb_kvs_handle *)auStack_b20._0_8_,(fdb_doc *)auStack_b20._16_8_);
          doc = auStack_b20._16_8_;
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pcStack_b30 = (code *)0x110763;
            crash_recovery_test();
LAB_00110763:
            pcStack_b30 = (code *)0x11076e;
            crash_recovery_test();
LAB_0011076e:
            pcStack_b30 = (code *)0x110779;
            crash_recovery_test();
            goto LAB_00110779;
          }
          ptr_fhandle = *(fdb_file_handle ***)(auStack_b20._16_8_ + 0x38);
          unaff_RBP = *(size_t *)(auStack_b00 + (long)unaff_R13 * 8 + 0x18);
          unaff_R12 = *(fdb_kvs_handle **)(unaff_RBP + 0x38);
          pcStack_b30 = (code *)0x110632;
          iVar6 = bcmp(ptr_fhandle,unaff_R12,*(size_t *)(auStack_b20._16_8_ + 8));
          pfVar25 = (fdb_doc *)doc;
          if (iVar6 != 0) goto LAB_00110763;
          ptr_fhandle = *(fdb_file_handle ***)(doc + 0x40);
          unaff_R12 = *(fdb_kvs_handle **)(unaff_RBP + 0x40);
          pcStack_b30 = (code *)0x110651;
          iVar6 = bcmp(ptr_fhandle,unaff_R12,*(size_t *)(doc + 0x10));
          if (iVar6 != 0) goto LAB_0011076e;
          pcStack_b30 = (code *)0x110661;
          fdb_doc_free((fdb_doc *)doc);
          unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
        } while (unaff_R13 != (undefined1 *)0xa);
        pfVar25 = (fdb_doc *)0x1;
        while( true ) {
          pcVar15 = (char *)0x0;
          pcStack_b30 = (code *)0x110695;
          fdb_doc_create((fdb_doc **)(auStack_b20 + 0x10),(void *)0x0,0,(void *)0x0,0,(void *)0x0,0)
          ;
          *(fdb_doc **)(auStack_b20._16_8_ + 0x28) = pfVar25;
          pcStack_b30 = (code *)0x1106a8;
          fVar5 = fdb_get_byseq((fdb_kvs_handle *)auStack_b20._0_8_,(fdb_doc *)auStack_b20._16_8_);
          if (fVar5 != FDB_RESULT_SUCCESS) break;
          pcStack_b30 = (code *)0x1106ba;
          fdb_doc_free((fdb_doc *)auStack_b20._16_8_);
          pfVar25 = (fdb_doc *)((long)&pfVar25->keylen + 1);
          if (pfVar25 == (fdb_doc *)0xb) {
            lVar18 = 0;
            do {
              pcStack_b30 = (code *)0x1106cf;
              fdb_doc_free(*(fdb_doc **)(auStack_b00 + lVar18 * 8 + 0x18));
              lVar18 = lVar18 + 1;
            } while (lVar18 != 10);
            pcStack_b30 = (code *)0x1106e2;
            fdb_kvs_close((fdb_kvs_handle *)auStack_b20._0_8_);
            pcStack_b30 = (code *)0x1106ec;
            fdb_close((fdb_file_handle *)auStack_b20._8_8_);
            pcStack_b30 = (code *)0x1106f1;
            fdb_shutdown();
            pcStack_b30 = (code *)0x1106f6;
            memleak_end();
            if ((char)uStack_b04 == '\0') {
              if ((crash_recovery_test(bool)::__test_pass & 1) == 0) {
                pcVar15 = "%s PASSED\n";
              }
              else {
                pcVar15 = "%s FAILED\n";
              }
              pcVar16 = "crash recovery test - normal flush";
            }
            else {
              if ((crash_recovery_test(bool)::__test_pass & 1) == 0) {
                pcVar15 = "%s PASSED\n";
              }
              else {
                pcVar15 = "%s FAILED\n";
              }
              pcVar16 = "crash recovery test - walflush";
            }
            pcStack_b30 = (code *)0x11074c;
            fprintf(_stderr,pcVar15,pcVar16);
            return;
          }
        }
LAB_00110779:
        pfVar17 = (fdb_kvs_handle *)(auStack_b20 + 0x10);
        pcStack_b30 = (code *)0x11077e;
        crash_recovery_test();
        goto LAB_0011077e;
      }
      goto LAB_00110797;
    }
LAB_001104ee:
    pcStack_b30 = (code *)0x1104f5;
    fVar5 = fdb_commit(fhandle,'\0');
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_001104fd;
  }
  else {
LAB_0011077e:
    pcStack_b30 = (code *)0x110783;
    crash_recovery_test();
LAB_00110783:
    pcStack_b30 = (code *)0x110788;
    crash_recovery_test();
LAB_00110788:
    pcStack_b30 = (code *)0x11078d;
    crash_recovery_test();
LAB_0011078d:
    pcStack_b30 = (code *)0x110792;
    crash_recovery_test();
LAB_00110792:
    pcStack_b30 = (code *)0x110797;
    crash_recovery_test();
LAB_00110797:
    pcStack_b30 = (code *)0x11079c;
    crash_recovery_test();
  }
  pcStack_b30 = snapshot_test;
  crash_recovery_test();
  pcVar16 = (char *)0x0;
  pfStack_1088 = (fdb_doc *)0x1107c4;
  fStack_d50.bub_ctx.space_used = (uint64_t)pfVar17;
  fStack_d50.bub_ctx.handle = unaff_R12;
  pfStack_b48 = (fdb_kvs_handle *)unaff_R13;
  pfStack_b40 = pfVar25;
  ppfStack_b38 = ptr_fhandle;
  pcStack_b30 = (code *)unaff_RBP;
  gettimeofday((timeval *)(apfStack_f88 + 5),(__timezone_ptr_t)0x0);
  pfStack_1088 = (fdb_doc *)0x1107c9;
  memleak_start();
  auStack_1058._0_8_ = (fdb_doc *)0x0;
  pfStack_1088 = (fdb_doc *)0x1107dd;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00 = (fdb_doc *)&fStack_d50.config.encryption_key;
  pfStack_1088 = (fdb_doc *)0x1107ed;
  fdb_get_default_config();
  config = (fdb_kvs_config *)auStack_1018;
  pfStack_1088 = (fdb_doc *)0x1107fa;
  fdb_get_default_kvs_config();
  fStack_d50.config.encryption_key.bytes[4] = '\0';
  fStack_d50.config.encryption_key.bytes[5] = '\0';
  fStack_d50.config.encryption_key.bytes[6] = '\0';
  fStack_d50.config.encryption_key.bytes[7] = '\0';
  fStack_d50.config.encryption_key.bytes[8] = '\0';
  fStack_d50.config.encryption_key.bytes[9] = '\0';
  fStack_d50.config.encryption_key.bytes[10] = '\0';
  fStack_d50.config.encryption_key.bytes[0xb] = '\0';
  fStack_d50.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_d50.config.encryption_key.bytes[0xc] = '\0';
  fStack_d50.config.encryption_key.bytes[0xd] = '\x04';
  fStack_d50.config.encryption_key.bytes[0xe] = '\0';
  fStack_d50.config.encryption_key.bytes[0xf] = '\0';
  fStack_d50.config.encryption_key.bytes[0x10] = '\0';
  fStack_d50.config.encryption_key.bytes[0x11] = '\0';
  fStack_d50.config.encryption_key.bytes[0x12] = '\0';
  fStack_d50.config.encryption_key.bytes[0x13] = '\0';
  fStack_d50.config._180_4_ = 1;
  fStack_d50.config.block_reusing_threshold._7_1_ = 0;
  pfStack_1088 = (fdb_doc *)0x110820;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar25 = (fdb_doc *)(auStack_1070 + 8);
  pfStack_1088 = (fdb_doc *)0x110837;
  fVar5 = fdb_open((fdb_file_handle **)pfVar25,"./mvcc_test1",(fdb_config *)fconfig_00);
  __s_00 = (fdb_doc *)(ulong)(uint)fVar5;
  pfStack_1088 = (fdb_doc *)0x110849;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1070._8_8_,&pfStack_1078,config);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_1088 = (fdb_doc *)0x110862;
    fVar5 = fdb_snapshot_open(pfStack_1078,&pfStack_1060,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111241;
    pfStack_1088 = (fdb_doc *)0x110879;
    fdb_get_kvs_info(pfStack_1060,(fdb_kvs_info *)(auStack_1058 + 0x10));
    if (pfStack_1040 != (fdb_doc *)0x0) {
      pfStack_1088 = (fdb_doc *)0x110889;
      snapshot_test();
    }
    pfVar25 = (fdb_doc *)auStack_1070;
    pcVar15 = (char *)0x0;
    pfStack_1088 = (fdb_doc *)0x1108ac;
    fdb_iterator_init(pfStack_1060,(fdb_iterator **)pfVar25,(void *)0x0,0,(void *)0x0,0,0);
    pfStack_1088 = (fdb_doc *)0x1108b9;
    fVar5 = fdb_iterator_get((fdb_iterator *)auStack_1070._0_8_,(fdb_doc **)auStack_1058);
    if (fVar5 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00111246;
    pfStack_1088 = (fdb_doc *)0x1108cc;
    fdb_iterator_close((fdb_iterator *)auStack_1070._0_8_);
    pfStack_1088 = (fdb_doc *)0x1108d6;
    fdb_kvs_close(pfStack_1060);
    lVar18 = 0;
    uVar24 = 0;
    do {
      pfStack_1088 = (fdb_doc *)0x1108f6;
      sprintf(acStack_f50,"key%d",uVar24 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x11090e;
      sprintf((char *)&fStack_d50,"meta%d",uVar24 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x110926;
      sprintf((char *)afStack_e50,"body%d",uVar24 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x110939;
      sVar8 = strlen(acStack_f50);
      pfStack_1088 = (fdb_doc *)0x11094c;
      sVar9 = strlen((char *)&fStack_d50);
      pfStack_1088 = (fdb_doc *)0x11095c;
      sVar10 = strlen((char *)afStack_e50);
      pfStack_1088 = (fdb_doc *)0x110981;
      fdb_doc_create((fdb_doc **)(auStack_1018 + lVar18 + 0x18),acStack_f50,sVar8,&fStack_d50,sVar9,
                     afStack_e50,sVar10);
      pfStack_1088 = (fdb_doc *)0x110993;
      fdb_set(pfStack_1078,apfStack_fd8[uVar24 - 5]);
      uVar24 = uVar24 + 1;
      lVar18 = lVar18 + 8;
    } while (uVar24 != 5);
    pfStack_1088 = (fdb_doc *)0x1109b3;
    fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\x01');
    uVar24 = 5;
    ppfVar26 = apfStack_fd8;
    do {
      pfStack_1088 = (fdb_doc *)0x1109db;
      sprintf(acStack_f50,"key%d",uVar24 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x1109f6;
      sprintf((char *)&fStack_d50,"meta%d",uVar24 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x110a11;
      sprintf((char *)afStack_e50,"body%d",uVar24 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x110a19;
      sVar8 = strlen(acStack_f50);
      pfStack_1088 = (fdb_doc *)0x110a24;
      sVar9 = strlen((char *)&fStack_d50);
      pfStack_1088 = (fdb_doc *)0x110a2f;
      sVar10 = strlen((char *)afStack_e50);
      pfStack_1088 = (fdb_doc *)0x110a4f;
      fdb_doc_create(ppfVar26,acStack_f50,sVar8,&fStack_d50,sVar9,afStack_e50,sVar10);
      pfStack_1088 = (fdb_doc *)0x110a5c;
      fdb_set(pfStack_1078,*ppfVar26);
      uVar24 = uVar24 + 1;
      ppfVar26 = ppfVar26 + 1;
    } while (uVar24 != 9);
    pfStack_1088 = (fdb_doc *)0x110a8b;
    sprintf(acStack_f50,"key%d",9);
    pfStack_1088 = (fdb_doc *)0x110aa9;
    sprintf((char *)&fStack_d50,"meta%d",9);
    pfStack_1088 = (fdb_doc *)0x110ac7;
    sprintf((char *)afStack_e50,"Body%d",9);
    pfStack_1088 = (fdb_doc *)0x110ad7;
    sVar8 = strlen(acStack_f50);
    pfStack_1088 = (fdb_doc *)0x110ae2;
    sVar9 = strlen((char *)&fStack_d50);
    pfStack_1088 = (fdb_doc *)0x110aed;
    sVar10 = strlen((char *)afStack_e50);
    pfStack_1088 = (fdb_doc *)0x110b08;
    fdb_doc_create(&pfStack_fb8,acStack_f50,sVar8,&fStack_d50,sVar9,afStack_e50,sVar10);
    pfStack_1088 = (fdb_doc *)0x110b16;
    fdb_set(pfStack_1078,pfStack_fb8);
    pfStack_1088 = (fdb_doc *)0x110b22;
    fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\0');
    *(undefined1 *)pfStack_fb8->body = 0x62;
    pfStack_1088 = (fdb_doc *)0x110b3b;
    fdb_set(pfStack_1078,pfStack_fb8);
    pfStack_1088 = (fdb_doc *)0x110b47;
    fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\0');
    auStack_1058._8_8_ = pfStack_fb8->seqnum;
    pfStack_1088 = (fdb_doc *)0x110b5e;
    fdb_set(pfStack_1078,pfStack_fb8);
    pfStack_1088 = (fdb_doc *)0x110b6a;
    fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\0');
    uVar24 = 10;
    unaff_R13 = (char *)0x50;
    do {
      pfStack_1088 = (fdb_doc *)0x110b90;
      sprintf(acStack_f50,"key%d",uVar24 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x110bab;
      sprintf((char *)&fStack_d50,"meta%d",uVar24 & 0xffffffff);
      __s_00 = afStack_e50;
      pfStack_1088 = (fdb_doc *)0x110bc6;
      sprintf((char *)__s_00,"body%d",uVar24 & 0xffffffff);
      pcVar16 = auStack_1018 + (long)unaff_R13 + 0x18;
      pfStack_1088 = (fdb_doc *)0x110bd9;
      fconfig_00 = (fdb_doc *)strlen(acStack_f50);
      pfStack_1088 = (fdb_doc *)0x110be4;
      config = (fdb_kvs_config *)strlen((char *)&fStack_d50);
      pfStack_1088 = (fdb_doc *)0x110bef;
      sVar8 = strlen((char *)__s_00);
      pcVar15 = (char *)&fStack_d50;
      pfStack_1088 = (fdb_doc *)0x110c14;
      fdb_doc_create((fdb_doc **)pcVar16,acStack_f50,(size_t)fconfig_00,pcVar15,(size_t)config,
                     __s_00,sVar8);
      pfStack_1088 = (fdb_doc *)0x110c26;
      fdb_set(pfStack_1078,apfStack_fd8[uVar24 - 5]);
      uVar24 = uVar24 + 1;
      unaff_R13 = (char *)((long)unaff_R13 + 8);
    } while (uVar24 != 0xf);
    pfStack_1088 = (fdb_doc *)0x110c46;
    fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\x01');
    pfStack_1088 = (fdb_doc *)0x110c5e;
    fVar5 = fdb_set_log_callback(pfStack_1078,logCallbackFunc,"snapshot_test");
    pfVar25 = (fdb_doc *)0xf;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011124b;
    pfStack_1088 = (fdb_doc *)0x110c7a;
    fVar5 = fdb_snapshot_open(pfStack_1078,&pfStack_1060,999999);
    fconfig_00 = (fdb_doc *)auStack_1058._8_8_;
    if (fVar5 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_00111250;
    pfStack_1088 = (fdb_doc *)0x110c9a;
    fVar5 = fdb_snapshot_open(pfStack_1078,&pfStack_1060,auStack_1058._8_8_);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111255;
    pfStack_1088 = (fdb_doc *)0x110cb4;
    fdb_get_kvs_info(pfStack_1060,(fdb_kvs_info *)(auStack_1058 + 0x10));
    if (pfStack_1040 != fconfig_00) {
      pfStack_1088 = (fdb_doc *)0x110cc7;
      snapshot_test();
    }
    uVar24 = 0xf;
    pfVar27 = (fdb_doc *)apfStack_f88;
    do {
      pfStack_1088 = (fdb_doc *)0x110cef;
      sprintf(acStack_f50,"key%d",uVar24 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x110d0a;
      sprintf((char *)&fStack_d50,"meta%d",uVar24 & 0xffffffff);
      __s_00 = afStack_e50;
      pfStack_1088 = (fdb_doc *)0x110d25;
      sprintf((char *)__s_00,"body%d",uVar24 & 0xffffffff);
      pfStack_1088 = (fdb_doc *)0x110d2d;
      config = (fdb_kvs_config *)strlen(acStack_f50);
      pfStack_1088 = (fdb_doc *)0x110d38;
      pcVar16 = (char *)strlen((char *)&fStack_d50);
      pfStack_1088 = (fdb_doc *)0x110d43;
      sVar8 = strlen((char *)__s_00);
      pfStack_1088 = (fdb_doc *)0x110d63;
      fdb_doc_create((fdb_doc **)pfVar27,acStack_f50,(size_t)config,&fStack_d50,(size_t)pcVar16,
                     __s_00,sVar8);
      pfStack_1088 = (fdb_doc *)0x110d70;
      fdb_set(pfStack_1078,*(fdb_doc **)pfVar27);
      uVar24 = uVar24 + 1;
      pfVar27 = (fdb_doc *)((long)pfVar27 + 8);
    } while (uVar24 != 0x14);
    unaff_R13 = (char *)0x0;
    pfStack_1088 = (fdb_doc *)0x110d90;
    fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\0');
    pcVar15 = (char *)0x0;
    pfStack_1088 = (fdb_doc *)0x110db0;
    fdb_iterator_init(pfStack_1060,(fdb_iterator **)auStack_1070,(void *)0x0,0,(void *)0x0,0,0);
    pfVar25 = (fdb_doc *)auStack_1058;
    do {
      pfStack_1088 = (fdb_doc *)0x110dc2;
      fVar5 = fdb_iterator_get((fdb_iterator *)auStack_1070._0_8_,(fdb_doc **)pfVar25);
      fconfig_00 = (fdb_doc *)auStack_1058._0_8_;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_001111fb:
        pfStack_1088 = (fdb_doc *)0x111200;
        snapshot_test();
        fconfig_00 = pfVar27;
LAB_00111200:
        pfStack_1088 = (fdb_doc *)0x11120b;
        snapshot_test();
LAB_0011120b:
        pfStack_1088 = (fdb_doc *)0x111216;
        snapshot_test();
        goto LAB_00111216;
      }
      config = *(fdb_kvs_config **)(auStack_1058._0_8_ + 0x20);
      __s_00 = apfStack_fd8
               [(long)((long)&(((fdb_kvs_handle *)((long)unaff_R13 + -0x208))->bub_ctx).handle + 3)]
      ;
      pcVar16 = (char *)__s_00->key;
      pfStack_1088 = (fdb_doc *)0x110ded;
      iVar6 = bcmp(config,pcVar16,*(size_t *)auStack_1058._0_8_);
      pfVar27 = fconfig_00;
      if (iVar6 != 0) {
        pfStack_1088 = (fdb_doc *)0x1111fb;
        snapshot_test();
        goto LAB_001111fb;
      }
      config = *(fdb_kvs_config **)((long)fconfig_00 + 0x38);
      pcVar16 = (char *)__s_00->meta;
      pfStack_1088 = (fdb_doc *)0x110e0c;
      iVar6 = bcmp(config,pcVar16,*(size_t *)((long)fconfig_00 + 8));
      if (iVar6 != 0) goto LAB_0011120b;
      config = *(fdb_kvs_config **)((long)fconfig_00 + 0x40);
      pcVar16 = (char *)__s_00->body;
      pfStack_1088 = (fdb_doc *)0x110e2b;
      iVar6 = bcmp(config,pcVar16,*(size_t *)((long)fconfig_00 + 0x10));
      if (iVar6 != 0) goto LAB_00111200;
      pfStack_1088 = (fdb_doc *)0x110e3b;
      fdb_doc_free(fconfig_00);
      auStack_1058._0_8_ = (fdb_doc *)0x0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
      pfStack_1088 = (fdb_doc *)0x110e51;
      fVar5 = fdb_iterator_next((fdb_iterator *)auStack_1070._0_8_);
    } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 != 10) goto LAB_0011125a;
    pfStack_1088 = (fdb_doc *)0x110e71;
    fdb_iterator_close((fdb_iterator *)auStack_1070._0_8_);
    unaff_R13 = (char *)0x0;
    pcVar15 = (char *)0x0;
    pfStack_1088 = (fdb_doc *)0x110e88;
    fdb_iterator_sequence_init(pfStack_1060,(fdb_iterator **)auStack_1070,0,0,0);
    pfVar25 = (fdb_doc *)auStack_1058;
    do {
      pfStack_1088 = (fdb_doc *)0x110e9a;
      fVar5 = fdb_iterator_get((fdb_iterator *)auStack_1070._0_8_,(fdb_doc **)pfVar25);
      fconfig_00 = (fdb_doc *)auStack_1058._0_8_;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111221;
      config = *(fdb_kvs_config **)(auStack_1058._0_8_ + 0x20);
      __s_00 = apfStack_fd8
               [(long)((long)&(((fdb_kvs_handle *)((long)unaff_R13 + -0x208))->bub_ctx).handle + 3)]
      ;
      pcVar16 = (char *)__s_00->key;
      pfStack_1088 = (fdb_doc *)0x110ec5;
      iVar6 = bcmp(config,pcVar16,*(size_t *)auStack_1058._0_8_);
      if (iVar6 != 0) goto LAB_00111216;
      config = *(fdb_kvs_config **)((long)fconfig_00 + 0x38);
      pcVar16 = (char *)__s_00->meta;
      pfStack_1088 = (fdb_doc *)0x110ee4;
      iVar6 = bcmp(config,pcVar16,*(size_t *)((long)fconfig_00 + 8));
      if (iVar6 != 0) goto LAB_00111231;
      config = *(fdb_kvs_config **)((long)fconfig_00 + 0x40);
      pcVar16 = (char *)__s_00->body;
      pfStack_1088 = (fdb_doc *)0x110f03;
      iVar6 = bcmp(config,pcVar16,*(size_t *)((long)fconfig_00 + 0x10));
      if (iVar6 != 0) goto LAB_00111226;
      pfStack_1088 = (fdb_doc *)0x110f13;
      fdb_doc_free(fconfig_00);
      auStack_1058._0_8_ = (fdb_doc *)0x0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
      pfStack_1088 = (fdb_doc *)0x110f29;
      fVar5 = fdb_iterator_next((fdb_iterator *)auStack_1070._0_8_);
      pfVar27 = fconfig_00;
    } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 != 10) goto LAB_0011125f;
    pfStack_1088 = (fdb_doc *)0x110f46;
    fdb_iterator_close((fdb_iterator *)auStack_1070._0_8_);
    pfStack_1088 = (fdb_doc *)0x110f50;
    fdb_kvs_close(pfStack_1078);
    pfStack_1088 = (fdb_doc *)0x110f5a;
    fdb_kvs_close(pfStack_1060);
    pfStack_1088 = (fdb_doc *)0x110f64;
    fdb_close((fdb_file_handle *)auStack_1070._8_8_);
    lVar18 = 0;
    do {
      pfStack_1088 = (fdb_doc *)0x110f73;
      fdb_doc_free(apfStack_fd8[lVar18 + -5]);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x14);
    pfStack_1088 = (fdb_doc *)0x110f95;
    fVar5 = fdb_open((fdb_file_handle **)(auStack_1070 + 8),"./mvcc_test2",
                     (fdb_config *)&fStack_d50.config.encryption_key);
    pfVar25 = (fdb_doc *)0x14;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111264;
    pcVar15 = auStack_1018;
    pfStack_1088 = (fdb_doc *)0x110fb8;
    fVar5 = fdb_kvs_open((fdb_file_handle *)auStack_1070._8_8_,&pfStack_1078,"kv2",
                         (fdb_kvs_config *)pcVar15);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111269;
    pcVar15 = "val-a";
    pfStack_1088 = (fdb_doc *)0x110fe3;
    fVar5 = fdb_set_kv(pfStack_1078,"a",1,"val-a",5);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011126e;
    pfStack_1088 = (fdb_doc *)0x110ff7;
    fVar5 = fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111273;
    pcVar15 = "val-b";
    pfStack_1088 = (fdb_doc *)0x111022;
    fVar5 = fdb_set_kv(pfStack_1078,"b",1,"val-b",5);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111278;
    pfStack_1088 = (fdb_doc *)0x111036;
    fVar5 = fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011127d;
    pcVar15 = "val-c";
    pfStack_1088 = (fdb_doc *)0x111061;
    fVar5 = fdb_set_kv(pfStack_1078,"c",1,"val-c",5);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111282;
    pfStack_1088 = (fdb_doc *)0x111075;
    fVar5 = fdb_commit((fdb_file_handle *)auStack_1070._8_8_,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111287;
    pfStack_1088 = (fdb_doc *)0x11108c;
    fVar5 = fdb_get_kvs_info(pfStack_1078,(fdb_kvs_info *)(auStack_1058 + 0x10));
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011128c;
    pcVar15 = (char *)0x1;
    pfStack_1088 = (fdb_doc *)0x1110c8;
    fVar5 = fdb_iterator_init(pfStack_1078,(fdb_iterator **)auStack_1070,"a",1,"c",1,0);
    pfVar25 = pfStack_1040;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111291;
    pcVar15 = (char *)0x0;
    pfStack_1088 = (fdb_doc *)0x1110e8;
    fVar5 = fdb_iterator_seek((fdb_iterator *)auStack_1070._0_8_,"b",1,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111296;
    pfStack_1088 = (fdb_doc *)0x1110fa;
    fVar5 = fdb_iterator_close((fdb_iterator *)auStack_1070._0_8_);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011129b;
    pfStack_1088 = (fdb_doc *)0x111114;
    fVar5 = fdb_snapshot_open(pfStack_1078,&pfStack_1060,(fdb_seqnum_t)pfStack_1040);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001112a0;
    pcVar15 = (char *)0x1;
    pfStack_1088 = (fdb_doc *)0x11114b;
    fVar5 = fdb_iterator_init(pfStack_1060,(fdb_iterator **)auStack_1070,"a",1,"c",1,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001112a5;
    pcVar15 = (char *)0x0;
    pfStack_1088 = (fdb_doc *)0x11116b;
    fVar5 = fdb_iterator_seek((fdb_iterator *)auStack_1070._0_8_,"b",1,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001112aa;
    pfStack_1088 = (fdb_doc *)0x11117d;
    fVar5 = fdb_iterator_close((fdb_iterator *)auStack_1070._0_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_1088 = (fdb_doc *)0x11118f;
      fdb_kvs_close(pfStack_1078);
      pfStack_1088 = (fdb_doc *)0x111199;
      fdb_kvs_close(pfStack_1060);
      pfStack_1088 = (fdb_doc *)0x1111a3;
      fdb_close((fdb_file_handle *)auStack_1070._8_8_);
      pfStack_1088 = (fdb_doc *)0x1111a8;
      fdb_shutdown();
      pfStack_1088 = (fdb_doc *)0x1111ad;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (snapshot_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pfStack_1088 = (fdb_doc *)0x1111de;
      fprintf(_stderr,pcVar15,"snapshot test");
      return;
    }
  }
  else {
LAB_0011123c:
    pfStack_1088 = (fdb_doc *)0x111241;
    snapshot_test();
LAB_00111241:
    pfStack_1088 = (fdb_doc *)0x111246;
    snapshot_test();
LAB_00111246:
    pfStack_1088 = (fdb_doc *)0x11124b;
    snapshot_test();
LAB_0011124b:
    pfStack_1088 = (fdb_doc *)0x111250;
    snapshot_test();
LAB_00111250:
    pfStack_1088 = (fdb_doc *)0x111255;
    snapshot_test();
LAB_00111255:
    pfStack_1088 = (fdb_doc *)0x11125a;
    snapshot_test();
LAB_0011125a:
    pfStack_1088 = (fdb_doc *)0x11125f;
    snapshot_test();
LAB_0011125f:
    pfStack_1088 = (fdb_doc *)0x111264;
    snapshot_test();
LAB_00111264:
    pfStack_1088 = (fdb_doc *)0x111269;
    snapshot_test();
LAB_00111269:
    pfStack_1088 = (fdb_doc *)0x11126e;
    snapshot_test();
LAB_0011126e:
    pfStack_1088 = (fdb_doc *)0x111273;
    snapshot_test();
LAB_00111273:
    pfStack_1088 = (fdb_doc *)0x111278;
    snapshot_test();
LAB_00111278:
    pfStack_1088 = (fdb_doc *)0x11127d;
    snapshot_test();
LAB_0011127d:
    pfStack_1088 = (fdb_doc *)0x111282;
    snapshot_test();
LAB_00111282:
    pfStack_1088 = (fdb_doc *)0x111287;
    snapshot_test();
LAB_00111287:
    pfStack_1088 = (fdb_doc *)0x11128c;
    snapshot_test();
LAB_0011128c:
    pfStack_1088 = (fdb_doc *)0x111291;
    snapshot_test();
LAB_00111291:
    pfStack_1088 = (fdb_doc *)0x111296;
    snapshot_test();
LAB_00111296:
    pfStack_1088 = (fdb_doc *)0x11129b;
    snapshot_test();
LAB_0011129b:
    pfStack_1088 = (fdb_doc *)0x1112a0;
    snapshot_test();
LAB_001112a0:
    pfStack_1088 = (fdb_doc *)0x1112a5;
    snapshot_test();
LAB_001112a5:
    pfStack_1088 = (fdb_doc *)0x1112aa;
    snapshot_test();
LAB_001112aa:
    pfStack_1088 = (fdb_doc *)0x1112af;
    snapshot_test();
  }
  pfStack_1088 = (fdb_doc *)snapshot_stats_test;
  snapshot_test();
  pfStack_15d0 = (fdb_kvs_handle *)0x1112d1;
  pfStack_10b0 = pfVar25;
  pfStack_10a8 = (fdb_kvs_handle *)pcVar16;
  pfStack_10a0 = (fdb_kvs_handle *)unaff_R13;
  pfStack_1098 = fconfig_00;
  pfStack_1090 = config;
  pfStack_1088 = __s_00;
  gettimeofday(&tStack_1570,(__timezone_ptr_t)0x0);
  pfStack_15d0 = (fdb_kvs_handle *)0x1112d6;
  memleak_start();
  pfStack_15d0 = (fdb_kvs_handle *)0x1112e5;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar11 = (fdb_config *)(auStack_13a8 + 0x200);
  pfStack_15d0 = (fdb_kvs_handle *)0x1112f5;
  fdb_get_default_config();
  pcVar29 = auStack_1560;
  pfStack_15d0 = (fdb_kvs_handle *)0x111302;
  fdb_get_default_kvs_config();
  uStack_11a0 = 0;
  uStack_1198 = 0x400;
  uStack_1184 = 1;
  uStack_1179 = 0;
  pfStack_15d0 = (fdb_kvs_handle *)0x111327;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_15d0 = (fdb_kvs_handle *)0x11133e;
  fVar5 = fdb_open((fdb_file_handle **)&phStack_15b0,"./mvcc_test1",pfVar11);
  handle._M_i = (__int_type)(uint)fVar5;
  pfStack_15d0 = (fdb_kvs_handle *)0x111350;
  fdb_kvs_open_default((fdb_file_handle *)phStack_15b0,&pfStack_15b8,(fdb_kvs_config *)pcVar29);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pcVar16 = (char *)0x0;
    uVar24 = 0;
    do {
      pfStack_15d0 = (fdb_kvs_handle *)0x111378;
      sprintf(auStack_13a8 + 0x100,"key%d",uVar24 & 0xffffffff);
      pfStack_15d0 = (fdb_kvs_handle *)0x111390;
      sprintf(auStack_13a8,"meta%d",uVar24 & 0xffffffff);
      pfStack_15d0 = (fdb_kvs_handle *)0x1113a8;
      sprintf(acStack_14a8,"body%d",uVar24 & 0xffffffff);
      pcVar29 = auStack_1560 + (long)pcVar16 + 0x18;
      pfStack_15d0 = (fdb_kvs_handle *)0x1113bb;
      unaff_R13 = (char *)strlen(auStack_13a8 + 0x100);
      handle._M_i = (__int_type)auStack_13a8;
      pfStack_15d0 = (fdb_kvs_handle *)0x1113ce;
      pfVar11 = (fdb_config *)strlen((char *)handle._M_i);
      pfStack_15d0 = (fdb_kvs_handle *)0x1113de;
      sVar8 = strlen(acStack_14a8);
      pfStack_15d0 = (fdb_kvs_handle *)0x111403;
      pcVar15 = (char *)handle._M_i;
      fdb_doc_create((fdb_doc **)pcVar29,auStack_13a8 + 0x100,(size_t)unaff_R13,(void *)handle._M_i,
                     (size_t)pfVar11,acStack_14a8,sVar8);
      pfStack_15d0 = (fdb_kvs_handle *)0x111415;
      fdb_set(pfStack_15b8,*(fdb_doc **)(auStack_1560 + uVar24 * 8 + 0x18));
      pfStack_15d0 = (fdb_kvs_handle *)0x111422;
      fdb_doc_free(*(fdb_doc **)(auStack_1560 + uVar24 * 8 + 0x18));
      uVar24 = uVar24 + 1;
      pcVar16 = (char *)((long)pcVar16 + 8);
    } while (uVar24 != 0x14);
    pfStack_15d0 = (fdb_kvs_handle *)0x111442;
    fdb_commit((fdb_file_handle *)phStack_15b0,'\x01');
    pfStack_15d0 = (fdb_kvs_handle *)0x111451;
    fVar5 = fdb_get_kvs_info(pfStack_15b8,(fdb_kvs_info *)(auStack_15a8 + 8));
    seqnum = pphStack_1598;
    pphVar4 = (hbtrie **)0x14;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001115d6;
    pfStack_15d0 = (fdb_kvs_handle *)0x111476;
    fVar5 = fdb_set_log_callback(pfStack_15b8,logCallbackFunc,"snapshot_stats_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001115db;
    pfStack_15d0 = (fdb_kvs_handle *)0x111490;
    fVar5 = fdb_snapshot_open(pfStack_15b8,(fdb_kvs_handle **)auStack_15a8,(fdb_seqnum_t)seqnum);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001115e0;
    pfVar11 = (fdb_config *)&pphStack_1598;
    pfStack_15d0 = (fdb_kvs_handle *)0x1114af;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_15a8._0_8_,(fdb_kvs_info *)(auStack_15a8 + 8));
    if (pphStack_1598 != seqnum) {
      pfStack_15d0 = (fdb_kvs_handle *)0x1114c0;
      snapshot_stats_test();
    }
    pcVar16 = (char *)apkStack_1590;
    if (apkStack_1590[0] != (kvs_info *)0x14) {
      pfStack_15d0 = (fdb_kvs_handle *)0x1114d4;
      snapshot_stats_test();
    }
    pcVar29 = (char *)&phStack_1578;
    if (phStack_1578 != phStack_15b0) {
      pfStack_15d0 = (fdb_kvs_handle *)0x1114f0;
      snapshot_stats_test();
    }
    unaff_R13 = auStack_15a8;
    pfStack_15d0 = (fdb_kvs_handle *)0x1114fe;
    fdb_kvs_close((fdb_kvs_handle *)auStack_15a8._0_8_);
    pfStack_15d0 = (fdb_kvs_handle *)0x111512;
    fVar5 = fdb_snapshot_open(pfStack_15b8,(fdb_kvs_handle **)unaff_R13,0xffffffffffffffff);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_15d0 = (fdb_kvs_handle *)0x11152c;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_15a8._0_8_,(fdb_kvs_info *)(auStack_15a8 + 8));
      if (pphStack_1598 != seqnum) {
        pfStack_15d0 = (fdb_kvs_handle *)0x11153d;
        snapshot_stats_test();
      }
      if (apkStack_1590[0] != (kvs_info *)0x14) {
        pfStack_15d0 = (fdb_kvs_handle *)0x11154d;
        snapshot_stats_test();
      }
      if (phStack_1578 != phStack_15b0) {
        pfStack_15d0 = (fdb_kvs_handle *)0x111566;
        snapshot_stats_test();
      }
      pfStack_15d0 = (fdb_kvs_handle *)0x111570;
      fdb_kvs_close((fdb_kvs_handle *)auStack_15a8._0_8_);
      pfStack_15d0 = (fdb_kvs_handle *)0x11157a;
      fdb_kvs_close(pfStack_15b8);
      pfStack_15d0 = (fdb_kvs_handle *)0x111584;
      fdb_close((fdb_file_handle *)phStack_15b0);
      pfStack_15d0 = (fdb_kvs_handle *)0x111589;
      fdb_shutdown();
      pfStack_15d0 = (fdb_kvs_handle *)0x11158e;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (snapshot_stats_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pfStack_15d0 = (fdb_kvs_handle *)0x1115bf;
      fprintf(_stderr,pcVar15,"snapshot stats test");
      return;
    }
  }
  else {
    pfStack_15d0 = (fdb_kvs_handle *)0x1115d6;
    snapshot_stats_test();
    pphVar4 = &phStack_15b0;
LAB_001115d6:
    seqnum = pphVar4;
    pfStack_15d0 = (fdb_kvs_handle *)0x1115db;
    snapshot_stats_test();
LAB_001115db:
    pfStack_15d0 = (fdb_kvs_handle *)0x1115e0;
    snapshot_stats_test();
LAB_001115e0:
    pfStack_15d0 = (fdb_kvs_handle *)0x1115e5;
    snapshot_stats_test();
  }
  pfStack_15d0 = (fdb_kvs_handle *)snapshot_with_uncomitted_data_test;
  snapshot_stats_test();
  pfStack_1998 = (fdb_kvs_handle *)0x11160a;
  pphStack_15f8 = seqnum;
  pfStack_15f0 = (fdb_kvs_handle *)pcVar16;
  pfStack_15e8 = (fdb_kvs_handle *)unaff_R13;
  pfStack_15e0 = pfVar11;
  pfStack_15d8 = (fdb_kvs_handle *)pcVar29;
  pfStack_15d0 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)(auStack_1928 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_1700 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_16f8,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_1998 = (fdb_kvs_handle *)0x111632;
  system((char *)&pfStack_1700);
  pfStack_1998 = (fdb_kvs_handle *)0x111637;
  memleak_start();
  pfStack_1998 = (fdb_kvs_handle *)0x111641;
  pfVar12 = (fdb_kvs_handle *)malloc(0x20);
  pfStack_1998 = (fdb_kvs_handle *)0x11164e;
  srand(0x4d2);
  pfVar17 = (fdb_kvs_handle *)(auStack_1900 + 0x108);
  pfStack_1998 = (fdb_kvs_handle *)0x11165e;
  fdb_get_default_config();
  uStack_17d8 = 1;
  uStack_17e0 = '\x01';
  uStack_17b8 = 1;
  sStack_17f0 = 0;
  pfStack_1998 = (fdb_kvs_handle *)0x11167e;
  fdb_get_default_kvs_config();
  pfStack_1998 = (fdb_kvs_handle *)0x111692;
  fVar5 = fdb_open(&pfStack_1970,"./mvcc_test9",(fdb_config *)pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pcVar15 = auStack_1928;
    pfStack_1998 = (fdb_kvs_handle *)0x1116b0;
    fVar5 = fdb_kvs_open(pfStack_1970,&pfStack_1980,(char *)0x0,(fdb_kvs_config *)pcVar15);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b4f;
    pcVar15 = auStack_1928;
    pfStack_1998 = (fdb_kvs_handle *)0x1116d3;
    fVar5 = fdb_kvs_open(pfStack_1970,&pfStack_1978,"db1",(fdb_kvs_config *)pcVar15);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b54;
    pcVar15 = auStack_1928;
    pfStack_1998 = (fdb_kvs_handle *)0x1116f6;
    fVar5 = fdb_kvs_open(pfStack_1970,&pfStack_1988,"db2",(fdb_kvs_config *)pcVar15);
    pcVar28 = (char *)pfVar17;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b59;
    puStack_1968 = (undefined4 *)
                   ((long)&(((atomic<unsigned_long> *)&pfVar12->kvs)->
                           super___atomic_base<unsigned_long>)._M_i + 2);
    pcVar28 = "key%06d";
    pcVar29 = auStack_1900;
    pcVar16 = "value%d";
    handle._M_i = 0;
    do {
      pfStack_1998 = (fdb_kvs_handle *)0x111731;
      sprintf(pcVar29,"key%06d",handle._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)
       &(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
        super___atomic_base<unsigned_long>)._M_i = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 4) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp_param)->
               super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp_param)->
               super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
      *(undefined2 *)(puStack_1968 + 1) = 0x3e;
      *puStack_1968 = 0x646e653c;
      pfStack_1998 = (fdb_kvs_handle *)0x11175f;
      sprintf((char *)pfVar12,"value%d",handle._M_i);
      pfVar17 = pfStack_1980;
      pfStack_1998 = (fdb_kvs_handle *)0x11176c;
      sVar8 = strlen(pcVar29);
      pfStack_1998 = (fdb_kvs_handle *)0x111784;
      pcVar15 = (char *)pfVar12;
      fVar5 = fdb_set_kv(pfVar17,pcVar29,sVar8 + 1,pfVar12,0x20);
      pfVar22 = pfStack_1978;
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_1998 = (fdb_kvs_handle *)0x111b36;
        snapshot_with_uncomitted_data_test();
LAB_00111b36:
        unaff_R13 = (char *)pfVar17;
        pfStack_1998 = (fdb_kvs_handle *)0x111b3b;
        snapshot_with_uncomitted_data_test();
LAB_00111b3b:
        pfStack_1998 = (fdb_kvs_handle *)0x111b40;
        snapshot_with_uncomitted_data_test();
        goto LAB_00111b40;
      }
      pfStack_1998 = (fdb_kvs_handle *)0x111799;
      sVar8 = strlen(pcVar29);
      pfStack_1998 = (fdb_kvs_handle *)0x1117b1;
      pcVar15 = (char *)pfVar12;
      fVar5 = fdb_set_kv(pfVar22,pcVar29,sVar8 + 1,pfVar12,0x20);
      unaff_R13 = (char *)pfStack_1988;
      pfVar17 = pfVar22;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b36;
      pfStack_1998 = (fdb_kvs_handle *)0x1117c6;
      sVar8 = strlen(pcVar29);
      pfStack_1998 = (fdb_kvs_handle *)0x1117de;
      pcVar15 = (char *)pfVar12;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,pcVar29,sVar8 + 1,pfVar12,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b3b;
      uVar20 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar20;
    } while (uVar20 != 10);
    pfStack_1998 = (fdb_kvs_handle *)0x111800;
    fVar5 = fdb_get_kvs_info(pfStack_1980,(fdb_kvs_info *)auStack_1960);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b5e;
    pfStack_1998 = (fdb_kvs_handle *)0x11181a;
    fVar5 = fdb_snapshot_open(pfStack_1980,&pfStack_1990,auStack_1960._8_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111b63;
    pfStack_1998 = (fdb_kvs_handle *)0x111831;
    fVar5 = fdb_get_kvs_info(pfStack_1978,(fdb_kvs_info *)auStack_1960);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b68;
    pfStack_1998 = (fdb_kvs_handle *)0x11184b;
    fVar5 = fdb_snapshot_open(pfStack_1978,&pfStack_1990,auStack_1960._8_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111b6d;
    pfStack_1998 = (fdb_kvs_handle *)0x111862;
    fVar5 = fdb_get_kvs_info(pfStack_1988,(fdb_kvs_info *)auStack_1960);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b72;
    pfStack_1998 = (fdb_kvs_handle *)0x11187c;
    fVar5 = fdb_snapshot_open(pfStack_1988,&pfStack_1990,auStack_1960._8_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111b77;
    pfStack_1998 = (fdb_kvs_handle *)0x111890;
    fVar5 = fdb_commit(pfStack_1970,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b7c;
    pfStack_1998 = (fdb_kvs_handle *)0x1118a7;
    fVar5 = fdb_get_kvs_info(pfStack_1978,(fdb_kvs_info *)auStack_1960);
    pfVar17 = (fdb_kvs_handle *)auStack_1960._8_8_;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b81;
    pfStack_1998 = (fdb_kvs_handle *)0x1118c2;
    fVar5 = fdb_get_kvs_info(pfStack_1988,(fdb_kvs_info *)auStack_1960);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b86;
    pcVar29 = auStack_1960 + 8;
    if (pfVar17 != (fdb_kvs_handle *)auStack_1960._8_8_) {
      pfStack_1998 = (fdb_kvs_handle *)0x1118df;
      snapshot_with_uncomitted_data_test();
    }
    pfStack_1998 = (fdb_kvs_handle *)0x1118ee;
    fVar5 = fdb_get_kvs_info(pfStack_1980,(fdb_kvs_info *)auStack_1960);
    pcVar28 = (char *)pfVar17;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b8b;
    if (pfVar17 != (fdb_kvs_handle *)auStack_1960._8_8_) {
      pfStack_1998 = (fdb_kvs_handle *)0x111908;
      snapshot_with_uncomitted_data_test();
    }
    pfStack_1930 = pfVar17;
    pcVar29 = "key%06d";
    pcVar16 = auStack_1900;
    unaff_R13 = "value%d";
    handle._M_i = 0;
    do {
      pfStack_1998 = (fdb_kvs_handle *)0x111934;
      sprintf(pcVar16,"key%06d",handle._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)
       &(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
        super___atomic_base<unsigned_long>)._M_i = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 4) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp_param)->
               super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp_param)->
               super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
      *(undefined2 *)(puStack_1968 + 1) = 0x3e;
      *puStack_1968 = 0x646e653c;
      pfStack_1998 = (fdb_kvs_handle *)0x111962;
      sprintf((char *)pfVar12,"value%d",handle._M_i);
      pfVar17 = pfStack_1980;
      pfStack_1998 = (fdb_kvs_handle *)0x11196f;
      sVar8 = strlen(pcVar16);
      pfStack_1998 = (fdb_kvs_handle *)0x111987;
      pcVar15 = (char *)pfVar12;
      fVar5 = fdb_set_kv(pfVar17,pcVar16,sVar8 + 1,pfVar12,0x20);
      pcVar28 = (char *)pfStack_1988;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b45;
      pfStack_1998 = (fdb_kvs_handle *)0x11199c;
      sVar8 = strlen(pcVar16);
      pfStack_1998 = (fdb_kvs_handle *)0x1119b4;
      pcVar15 = (char *)pfVar12;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)pcVar28,pcVar16,sVar8 + 1,pfVar12,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b40;
      uVar20 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar20;
    } while (uVar20 != 10);
    pfStack_1998 = (fdb_kvs_handle *)0x1119d6;
    fVar5 = fdb_get_kvs_info(pfStack_1978,(fdb_kvs_info *)auStack_1960);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b90;
    pfStack_1998 = (fdb_kvs_handle *)0x1119f0;
    fVar5 = fdb_snapshot_open(pfStack_1978,&pfStack_1990,auStack_1960._8_8_);
    pcVar28 = (char *)pfStack_1930;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b95;
    pfStack_1998 = (fdb_kvs_handle *)0x111a06;
    fVar5 = fdb_kvs_close(pfStack_1990);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b9a;
    pfStack_1998 = (fdb_kvs_handle *)0x111a1d;
    fVar5 = fdb_get_kvs_info(pfStack_1988,(fdb_kvs_info *)auStack_1960);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b9f;
    pfStack_1998 = (fdb_kvs_handle *)0x111a37;
    fVar5 = fdb_snapshot_open(pfStack_1988,&pfStack_1990,auStack_1960._8_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111ba4;
    pfStack_1998 = (fdb_kvs_handle *)0x111a4f;
    fVar5 = fdb_snapshot_open(pfStack_1988,&pfStack_1990,(fdb_seqnum_t)pcVar28);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111ba9;
    pfStack_1998 = (fdb_kvs_handle *)0x111a60;
    fVar5 = fdb_kvs_close(pfStack_1990);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111bae;
    pfStack_1998 = (fdb_kvs_handle *)0x111a77;
    fVar5 = fdb_get_kvs_info(pfStack_1980,(fdb_kvs_info *)auStack_1960);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111bb3;
    pfStack_1998 = (fdb_kvs_handle *)0x111a91;
    fVar5 = fdb_snapshot_open(pfStack_1980,&pfStack_1990,auStack_1960._8_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111bb8;
    pfStack_1998 = (fdb_kvs_handle *)0x111aa9;
    fVar5 = fdb_snapshot_open(pfStack_1980,&pfStack_1990,(fdb_seqnum_t)pcVar28);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111bbd;
    pfStack_1998 = (fdb_kvs_handle *)0x111aba;
    fVar5 = fdb_kvs_close(pfStack_1990);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111bc2;
    pfStack_1998 = (fdb_kvs_handle *)0x111acc;
    fVar5 = fdb_close(pfStack_1970);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111bc7;
    pfStack_1998 = (fdb_kvs_handle *)0x111ad9;
    fVar5 = fdb_shutdown();
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_1998 = (fdb_kvs_handle *)0x111ae9;
      free(pfVar12);
      pfStack_1998 = (fdb_kvs_handle *)0x111aee;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (snapshot_with_uncomitted_data_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pfStack_1998 = (fdb_kvs_handle *)0x111b1f;
      fprintf(_stderr,pcVar15,"snapshot with uncomitted data in other KVS test");
      return;
    }
  }
  else {
LAB_00111b4a:
    pfStack_1998 = (fdb_kvs_handle *)0x111b4f;
    snapshot_with_uncomitted_data_test();
LAB_00111b4f:
    pfStack_1998 = (fdb_kvs_handle *)0x111b54;
    snapshot_with_uncomitted_data_test();
LAB_00111b54:
    pfStack_1998 = (fdb_kvs_handle *)0x111b59;
    snapshot_with_uncomitted_data_test();
    pcVar28 = (char *)pfVar17;
LAB_00111b59:
    pfStack_1998 = (fdb_kvs_handle *)0x111b5e;
    snapshot_with_uncomitted_data_test();
LAB_00111b5e:
    pfStack_1998 = (fdb_kvs_handle *)0x111b63;
    snapshot_with_uncomitted_data_test();
LAB_00111b63:
    pfStack_1998 = (fdb_kvs_handle *)0x111b68;
    snapshot_with_uncomitted_data_test();
LAB_00111b68:
    pfStack_1998 = (fdb_kvs_handle *)0x111b6d;
    snapshot_with_uncomitted_data_test();
LAB_00111b6d:
    pfStack_1998 = (fdb_kvs_handle *)0x111b72;
    snapshot_with_uncomitted_data_test();
LAB_00111b72:
    pfStack_1998 = (fdb_kvs_handle *)0x111b77;
    snapshot_with_uncomitted_data_test();
LAB_00111b77:
    pfStack_1998 = (fdb_kvs_handle *)0x111b7c;
    snapshot_with_uncomitted_data_test();
LAB_00111b7c:
    pfStack_1998 = (fdb_kvs_handle *)0x111b81;
    snapshot_with_uncomitted_data_test();
LAB_00111b81:
    pfVar17 = (fdb_kvs_handle *)pcVar28;
    pfStack_1998 = (fdb_kvs_handle *)0x111b86;
    snapshot_with_uncomitted_data_test();
LAB_00111b86:
    pfStack_1998 = (fdb_kvs_handle *)0x111b8b;
    snapshot_with_uncomitted_data_test();
    pcVar28 = (char *)pfVar17;
LAB_00111b8b:
    pfStack_1998 = (fdb_kvs_handle *)0x111b90;
    snapshot_with_uncomitted_data_test();
LAB_00111b90:
    pfStack_1998 = (fdb_kvs_handle *)0x111b95;
    snapshot_with_uncomitted_data_test();
LAB_00111b95:
    pfStack_1998 = (fdb_kvs_handle *)0x111b9a;
    snapshot_with_uncomitted_data_test();
LAB_00111b9a:
    pfStack_1998 = (fdb_kvs_handle *)0x111b9f;
    snapshot_with_uncomitted_data_test();
LAB_00111b9f:
    pfStack_1998 = (fdb_kvs_handle *)0x111ba4;
    snapshot_with_uncomitted_data_test();
LAB_00111ba4:
    pfStack_1998 = (fdb_kvs_handle *)0x111ba9;
    snapshot_with_uncomitted_data_test();
LAB_00111ba9:
    pfStack_1998 = (fdb_kvs_handle *)0x111bae;
    snapshot_with_uncomitted_data_test();
LAB_00111bae:
    pfStack_1998 = (fdb_kvs_handle *)0x111bb3;
    snapshot_with_uncomitted_data_test();
LAB_00111bb3:
    pfStack_1998 = (fdb_kvs_handle *)0x111bb8;
    snapshot_with_uncomitted_data_test();
LAB_00111bb8:
    pfStack_1998 = (fdb_kvs_handle *)0x111bbd;
    snapshot_with_uncomitted_data_test();
LAB_00111bbd:
    pfStack_1998 = (fdb_kvs_handle *)0x111bc2;
    snapshot_with_uncomitted_data_test();
LAB_00111bc2:
    pfStack_1998 = (fdb_kvs_handle *)0x111bc7;
    snapshot_with_uncomitted_data_test();
LAB_00111bc7:
    pfStack_1998 = (fdb_kvs_handle *)0x111bcc;
    snapshot_with_uncomitted_data_test();
  }
  pfStack_1998 = (fdb_kvs_handle *)in_memory_snapshot_test;
  snapshot_with_uncomitted_data_test();
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bf1;
  pfStack_19c0 = pfVar12;
  pfStack_19b8 = (fdb_kvs_handle *)pcVar16;
  pfStack_19b0 = (fdb_kvs_handle *)unaff_R13;
  pfStack_19a8 = (fdb_kvs_handle *)pcVar28;
  pfStack_19a0 = (fdb_kvs_handle *)pcVar29;
  pfStack_1998 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)(auStack_1e68 + 0xa0),(__timezone_ptr_t)0x0);
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bf6;
  memleak_start();
  pcVar28 = "rm -rf  mvcc_test* > errorlog.txt";
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c05;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar11 = &fStack_1ab8;
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c15;
  fdb_get_default_config();
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c1f;
  fdb_get_default_kvs_config();
  fStack_1ab8.buffercache_size = 0;
  fStack_1ab8.wal_threshold = 0x400;
  fStack_1ab8.flags = 1;
  fStack_1ab8.compaction_threshold = '\0';
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c44;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c58;
  fVar5 = fdb_open(&pfStack_1ed0,"./mvcc_test1",pfVar11);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c74;
    fVar5 = fdb_kvs_open_default(pfStack_1ed0,&pfStack_1ee0,&fStack_1e80);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112359;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c8d;
    fVar5 = fdb_snapshot_open(pfStack_1ee0,&pfStack_1ed8,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011235e;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ca4;
    fdb_get_kvs_info(pfStack_1ed8,&fStack_1eb0);
    if ((fdb_config *)fStack_1eb0.last_seqnum != (fdb_config *)0x0) {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cb4;
      in_memory_snapshot_test();
    }
    pcVar28 = auStack_1ec8;
    pcVar15 = (char *)0x0;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cd7;
    fdb_iterator_init(pfStack_1ed8,(fdb_iterator **)pcVar28,(void *)0x0,0,(void *)0x0,0,0);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ce4;
    fVar5 = fdb_iterator_get((fdb_iterator *)auStack_1ec8._0_8_,(fdb_doc **)(auStack_1ec8 + 8));
    doc_00._M_i = (__int_type)pfVar11;
    if (fVar5 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00112363;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cf7;
    fdb_iterator_close((fdb_iterator *)auStack_1ec8._0_8_);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d01;
    fdb_kvs_close(pfStack_1ed8);
    lVar18 = 0;
    uVar24 = 0;
    do {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d23;
      sprintf(acStack_1db8,"key%d",uVar24 & 0xffffffff);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d3f;
      sprintf(auStack_1cb8,"meta%d",uVar24 & 0xffffffff);
      pcVar15 = auStack_1cb8 + 0x100;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d5b;
      sprintf(pcVar15,"body%d",uVar24 & 0xffffffff);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d6e;
      sVar8 = strlen(acStack_1db8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d79;
      sVar9 = strlen(auStack_1cb8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d84;
      sVar10 = strlen(pcVar15);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111da9;
      fdb_doc_create((fdb_doc **)(auStack_1e68 + lVar18),acStack_1db8,sVar8,auStack_1cb8,sVar9,
                     pcVar15,sVar10);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111dbb;
      fdb_set(pfStack_1ee0,*(fdb_doc **)(auStack_1e68 + uVar24 * 8));
      uVar24 = uVar24 + 1;
      lVar18 = lVar18 + 8;
    } while (uVar24 != 5);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ddb;
    fdb_commit(pfStack_1ed0,'\x01');
    uVar24 = 5;
    ppfVar26 = (fdb_doc **)(auStack_1e68 + 0x28);
    do {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e05;
      sprintf(acStack_1db8,"key%d",uVar24 & 0xffffffff);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e21;
      sprintf(auStack_1cb8,"meta%d",uVar24 & 0xffffffff);
      pcVar15 = auStack_1cb8 + 0x100;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e3d;
      sprintf(pcVar15,"body%d",uVar24 & 0xffffffff);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e45;
      sVar8 = strlen(acStack_1db8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e50;
      sVar9 = strlen(auStack_1cb8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e5b;
      sVar10 = strlen(pcVar15);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e7b;
      fdb_doc_create(ppfVar26,acStack_1db8,sVar8,auStack_1cb8,sVar9,pcVar15,sVar10);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e88;
      fdb_set(pfStack_1ee0,*ppfVar26);
      uVar24 = uVar24 + 1;
      ppfVar26 = ppfVar26 + 1;
    } while (uVar24 != 9);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111eb7;
    sprintf(acStack_1db8,"key%d",9);
    pcVar29 = auStack_1cb8;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ed5;
    sprintf(pcVar29,"meta%d",9);
    pcVar16 = auStack_1cb8 + 0x100;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ef3;
    sprintf(pcVar16,"Body%d",9);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f03;
    unaff_R13 = (char *)strlen(acStack_1db8);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f0e;
    handle._M_i = strlen(pcVar29);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f19;
    sVar8 = strlen(pcVar16);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f34;
    pcVar15 = pcVar29;
    fdb_doc_create((fdb_doc **)(auStack_1e68 + 0x48),acStack_1db8,(size_t)unaff_R13,pcVar29,
                   handle._M_i,pcVar16,sVar8);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f41;
    fdb_set(pfStack_1ee0,(fdb_doc *)auStack_1e68._72_8_);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f4d;
    fdb_commit(pfStack_1ed0,'\0');
    **(undefined1 **)(auStack_1e68._72_8_ + 0x40) = 0x62;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f64;
    fdb_set(pfStack_1ee0,(fdb_doc *)auStack_1e68._72_8_);
    doc_00._M_i = *(fdb_seqnum_t *)(auStack_1e68._72_8_ + 0x28);
    pcVar28 = (char *)&fStack_1eb0;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f7d;
    fdb_get_kvs_info(pfStack_1ee0,(fdb_kvs_info *)pcVar28);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f90;
    fVar5 = fdb_snapshot_open(pfStack_1ee0,&pfStack_1ed8,fStack_1eb0.last_seqnum);
    if (fVar5 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_00112368;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fb4;
    pfStack_1eb8 = (fdb_config *)doc_00._M_i;
    fVar5 = fdb_snapshot_open(pfStack_1ee0,&pfStack_1ed8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011236d;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fc8;
    fdb_commit(pfStack_1ed0,'\0');
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fda;
    fdb_set(pfStack_1ee0,(fdb_doc *)auStack_1e68._72_8_);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fe6;
    fdb_commit(pfStack_1ed0,'\0');
    uVar24 = 10;
    pcVar28 = (char *)0x50;
    do {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11200d;
      sprintf(acStack_1db8,"key%d",uVar24 & 0xffffffff);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112029;
      sprintf(auStack_1cb8,"meta%d",uVar24 & 0xffffffff);
      pcVar16 = auStack_1cb8 + 0x100;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112045;
      sprintf(pcVar16,"body%d",uVar24 & 0xffffffff);
      handle._M_i = (__int_type)(auStack_1e68 + (long)pcVar28);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112058;
      doc_00._M_i = strlen(acStack_1db8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112063;
      unaff_R13 = (char *)strlen(auStack_1cb8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11206e;
      sVar8 = strlen(pcVar16);
      pcVar15 = auStack_1cb8;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112093;
      fdb_doc_create((fdb_doc **)handle._M_i,acStack_1db8,doc_00._M_i,pcVar15,(size_t)unaff_R13,
                     pcVar16,sVar8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120a5;
      fdb_set(pfStack_1ee0,*(fdb_doc **)(auStack_1e68 + uVar24 * 8));
      uVar24 = uVar24 + 1;
      pcVar28 = (char *)((long)pcVar28 + 8);
    } while (uVar24 != 0xf);
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120ce;
    fVar5 = fdb_set_log_callback(pfStack_1ee0,logCallbackFunc,"in_memory_snapshot_test");
    pcVar29 = (char *)0xf;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112372;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120e8;
    fdb_get_kvs_info(pfStack_1ed8,&fStack_1eb0);
    if ((fdb_config *)fStack_1eb0.last_seqnum != pfStack_1eb8) {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120fd;
      in_memory_snapshot_test();
    }
    uVar24 = 0xf;
    pfVar11 = (fdb_config *)(auStack_1e68 + 0x78);
    do {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112125;
      sprintf(acStack_1db8,"key%d",uVar24 & 0xffffffff);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112140;
      sprintf(auStack_1cb8,"meta%d",uVar24 & 0xffffffff);
      handle._M_i = (__int_type)(auStack_1cb8 + 0x100);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11215b;
      sprintf((char *)handle._M_i,"body%d",uVar24 & 0xffffffff);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112163;
      pcVar29 = (char *)strlen(acStack_1db8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11216e;
      pcVar16 = (char *)strlen(auStack_1cb8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112179;
      sVar8 = strlen((char *)handle._M_i);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112199;
      fdb_doc_create((fdb_doc **)pfVar11,acStack_1db8,(size_t)pcVar29,auStack_1cb8,(size_t)pcVar16,
                     (void *)handle._M_i,sVar8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121a6;
      fdb_set(pfStack_1ee0,*(fdb_doc **)pfVar11);
      uVar24 = uVar24 + 1;
      pfVar11 = (fdb_config *)((long)pfVar11 + 8);
    } while (uVar24 != 0x14);
    unaff_R13 = (char *)0x0;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121c6;
    fdb_commit(pfStack_1ed0,'\0');
    pcVar15 = (char *)0x0;
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121e6;
    fdb_iterator_init(pfStack_1ed8,(fdb_iterator **)auStack_1ec8,(void *)0x0,0,(void *)0x0,0,0);
    pcVar28 = auStack_1ec8 + 8;
    auStack_1ec8._8_8_ = (fdb_config *)0x0;
    do {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121ff;
      fVar5 = fdb_iterator_get((fdb_iterator *)auStack_1ec8._0_8_,(fdb_doc **)pcVar28);
      doc_00._M_i = auStack_1ec8._8_8_;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00112339:
        aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11233e
        ;
        in_memory_snapshot_test();
LAB_0011233e:
        aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112349
        ;
        in_memory_snapshot_test();
LAB_00112349:
        aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112354
        ;
        in_memory_snapshot_test();
        goto LAB_00112354;
      }
      pcVar29 = *(char **)(auStack_1ec8._8_8_ + 0x20);
      handle._M_i = *(__int_type *)(auStack_1e68 + (long)unaff_R13 * 8);
      pcVar16 = (char *)(((atomic<unsigned_long> *)&((fdb_kvs_handle *)handle._M_i)->op_stats)->
                        super___atomic_base<unsigned_long>)._M_i;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11222a;
      iVar6 = bcmp(pcVar29,pcVar16,*(size_t *)auStack_1ec8._8_8_);
      pfVar11 = (fdb_config *)doc_00._M_i;
      if (iVar6 != 0) {
        aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112339
        ;
        in_memory_snapshot_test();
        goto LAB_00112339;
      }
      pcVar29 = *(char **)(doc_00._M_i + 0x38);
      pcVar16 = (char *)((fdb_kvs_handle *)handle._M_i)->staletree;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112249;
      iVar6 = bcmp(pcVar29,pcVar16,*(uint64_t *)(doc_00._M_i + 8));
      if (iVar6 != 0) goto LAB_00112349;
      pcVar29 = *(char **)(doc_00._M_i + 0x40);
      pcVar16 = (char *)(((fdb_kvs_handle *)handle._M_i)->field_6).seqtree;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112268;
      iVar6 = bcmp(pcVar29,pcVar16,*(uint64_t *)(doc_00._M_i + 0x10));
      if (iVar6 != 0) goto LAB_0011233e;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112278;
      fdb_doc_free((fdb_doc *)doc_00._M_i);
      auStack_1ec8._8_8_ = (fdb_config *)0x0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11228e;
      fVar5 = fdb_iterator_next((fdb_iterator *)auStack_1ec8._0_8_);
    } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 == 10) {
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122ab;
      fdb_iterator_close((fdb_iterator *)auStack_1ec8._0_8_);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122b5;
      fdb_kvs_close(pfStack_1ee0);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122bf;
      fdb_kvs_close(pfStack_1ed8);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122c9;
      fdb_close(pfStack_1ed0);
      lVar18 = 0;
      do {
        aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122d8
        ;
        fdb_doc_free(*(fdb_doc **)(auStack_1e68 + lVar18 * 8));
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x14);
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122e6;
      fdb_shutdown();
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122eb;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (in_memory_snapshot_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11231c;
      fprintf(_stderr,pcVar15,"in-memory snapshot test");
      return;
    }
  }
  else {
LAB_00112354:
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112359;
    in_memory_snapshot_test();
LAB_00112359:
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11235e;
    in_memory_snapshot_test();
LAB_0011235e:
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112363;
    in_memory_snapshot_test();
    doc_00._M_i = (__int_type)pfVar11;
LAB_00112363:
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112368;
    in_memory_snapshot_test();
LAB_00112368:
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11236d;
    in_memory_snapshot_test();
LAB_0011236d:
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112372;
    in_memory_snapshot_test();
LAB_00112372:
    aStack_1ef0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112377;
    in_memory_snapshot_test();
  }
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)in_memory_snapshot_cleanup_test;
  in_memory_snapshot_test();
  handle_00 = (char *)0x0;
  pfStack_2118 = (fdb_kvs_handle *)0x11239f;
  pfStack_1f18 = (fdb_kvs_info *)pcVar28;
  aStack_1f10.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)pcVar16;
  pfStack_1f08 = (fdb_kvs_handle *)unaff_R13;
  aStack_1f00.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)doc_00._M_i;
  pfStack_1ef8 = (fdb_kvs_handle *)pcVar29;
  aStack_1ef0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)handle._M_i;
  gettimeofday(&tStack_2040,(__timezone_ptr_t)0x0);
  pfStack_2118 = (fdb_kvs_handle *)0x1123a4;
  memleak_start();
  aStack_20f8.seqtree = (btree *)0x0;
  pcVar29 = "rm -rf  mvcc_test* > errorlog.txt";
  pfStack_2118 = (fdb_kvs_handle *)0x1123b8;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar17 = (fdb_kvs_handle *)&fStack_2030.seqtree_opt;
  pfStack_2118 = (fdb_kvs_handle *)0x1123c8;
  fdb_get_default_config();
  pfStack_2118 = (fdb_kvs_handle *)0x1123d2;
  fdb_get_default_kvs_config();
  fStack_2030.compaction_minimum_filesize = 0x400;
  fStack_2030._68_4_ = 1;
  fStack_2030.prefetch_duration._7_1_ = '\0';
  fStack_2030.breakpad_minidump_dir = (char *)0x0;
  pfStack_2118 = (fdb_kvs_handle *)0x1123f6;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_2118 = (fdb_kvs_handle *)0x11240a;
  fVar5 = fdb_open(&pfStack_2100,"./mvcc_test1",(fdb_config *)pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_2118 = (fdb_kvs_handle *)0x112426;
    fVar5 = fdb_kvs_open_default(pfStack_2100,&pfStack_2108,&fStack_20b8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127ba;
    pfStack_2118 = (fdb_kvs_handle *)0x112446;
    fVar5 = fdb_set_log_callback(pfStack_2108,logCallbackFunc,"in_memory_snapshot_cleanup_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127bf;
    pcVar29 = (char *)aaStack_2060;
    aaStack_2060[0]._0_4_ = 0x79656b;
    pfVar17 = (fdb_kvs_handle *)&fStack_2080;
    fStack_2080._4_1_ = 0;
    fStack_2080.create_if_missing = true;
    fStack_2080._1_3_ = 0x617465;
    handle_00 = &fStack_20a0.create_if_missing;
    fStack_20a0._4_1_ = 0;
    fStack_20a0.create_if_missing = true;
    fStack_20a0._1_3_ = 0x79646f;
    pfStack_2118 = (fdb_kvs_handle *)0x112489;
    pcVar16 = (char *)strlen(pcVar29);
    pfStack_2118 = (fdb_kvs_handle *)0x112494;
    unaff_R13 = (char *)strlen((char *)pfVar17);
    pfStack_2118 = (fdb_kvs_handle *)0x11249f;
    sVar8 = strlen(handle_00);
    handle._M_i = (__int_type)&aStack_20f8;
    pfStack_2118 = (fdb_kvs_handle *)0x1124bf;
    pcVar15 = (char *)pfVar17;
    fdb_doc_create((fdb_doc **)handle._M_i,pcVar29,(size_t)pcVar16,pfVar17,(size_t)unaff_R13,
                   handle_00,sVar8);
    pfStack_2118 = (fdb_kvs_handle *)0x1124cd;
    fdb_set(pfStack_2108,(fdb_doc *)aStack_20f8.seqtree);
    pfStack_2118 = (fdb_kvs_handle *)0x1124d9;
    fdb_commit(pfStack_2100,'\0');
    pfStack_2118 = (fdb_kvs_handle *)0x1124ef;
    fVar5 = fdb_snapshot_open(pfStack_2108,&pfStack_20d8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127c4;
    pfStack_2118 = (fdb_kvs_handle *)0x112506;
    fVar5 = fdb_set(pfStack_2108,(fdb_doc *)aStack_20f8.seqtree);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127c9;
    pfStack_2118 = (fdb_kvs_handle *)0x11251a;
    fVar5 = fdb_commit(pfStack_2100,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127ce;
    pfStack_2118 = (fdb_kvs_handle *)0x112538;
    fVar5 = fdb_snapshot_open(pfStack_2108,&pfStack_20e0,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127d3;
    pfStack_2118 = (fdb_kvs_handle *)0x11254f;
    fVar5 = fdb_set(pfStack_2108,(fdb_doc *)aStack_20f8.seqtree);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127d8;
    pfStack_2118 = (fdb_kvs_handle *)0x112563;
    fVar5 = fdb_commit(pfStack_2100,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127dd;
    pfStack_2118 = (fdb_kvs_handle *)0x11257a;
    fVar5 = fdb_set(pfStack_2108,(fdb_doc *)aStack_20f8.seqtree);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127e2;
    pfStack_2118 = (fdb_kvs_handle *)0x11258e;
    fVar5 = fdb_commit(pfStack_2100,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127e7;
    pcVar29 = (char *)&aStack_20f8;
    pfStack_2118 = (fdb_kvs_handle *)0x1125a3;
    fdb_doc_free((fdb_doc *)aStack_20f8.seqtree);
    pfVar17 = (fdb_kvs_handle *)&fStack_2030;
    fStack_2030.chunksize = 0x654b;
    fStack_2030._2_2_ = 0x79;
    pfStack_2118 = (fdb_kvs_handle *)0x1125ba;
    handle_00 = (char *)strlen((char *)pfVar17);
    pcVar16 = &fStack_2080.create_if_missing;
    pfStack_2118 = (fdb_kvs_handle *)0x1125cd;
    unaff_R13 = (char *)strlen(pcVar16);
    handle._M_i = (__int_type)&fStack_20a0;
    pfStack_2118 = (fdb_kvs_handle *)0x1125dd;
    sVar8 = strlen((char *)handle._M_i);
    pfStack_2118 = (fdb_kvs_handle *)0x1125f8;
    pcVar15 = pcVar16;
    fdb_doc_create((fdb_doc **)pcVar29,pfVar17,(size_t)handle_00,pcVar16,(size_t)unaff_R13,
                   (void *)handle._M_i,sVar8);
    pfStack_2118 = (fdb_kvs_handle *)0x112605;
    fdb_set(pfStack_2108,(fdb_doc *)aStack_20f8.seqtree);
    pfStack_2118 = (fdb_kvs_handle *)0x11261b;
    fVar5 = fdb_snapshot_open(pfStack_2108,&pfStack_20e8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127ec;
    pcVar29 = (char *)aaStack_2060;
    pfStack_2118 = (fdb_kvs_handle *)0x112633;
    sVar8 = strlen(pcVar29);
    pfVar17 = (fdb_kvs_handle *)&pfStack_20f0;
    pcVar15 = (char *)0x0;
    pfStack_2118 = (fdb_kvs_handle *)0x112656;
    fdb_doc_create((fdb_doc **)pfVar17,pcVar29,sVar8,(void *)0x0,0,(void *)0x0,0);
    pfStack_2118 = (fdb_kvs_handle *)0x112663;
    fVar5 = fdb_get(pfStack_20d8,pfStack_20f0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127f1;
    pfStack_2118 = (fdb_kvs_handle *)0x11267a;
    fVar5 = fdb_get(pfStack_20e0,pfStack_20f0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127f6;
    pfStack_2118 = (fdb_kvs_handle *)0x112691;
    fVar5 = fdb_get(pfStack_20e8,pfStack_20f0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127fb;
    pfStack_2118 = (fdb_kvs_handle *)0x1126a3;
    fdb_doc_free(pfStack_20f0);
    pfStack_2118 = (fdb_kvs_handle *)0x1126b7;
    fVar5 = fdb_snapshot_open(pfStack_2108,&pfStack_20c0,1);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112800;
    pfStack_2118 = (fdb_kvs_handle *)0x1126d3;
    fVar5 = fdb_snapshot_open(pfStack_2108,&pfStack_20c8,2);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112805;
    pfStack_2118 = (fdb_kvs_handle *)0x1126ef;
    fVar5 = fdb_snapshot_open(pfStack_2108,&pfStack_20d0,3);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011280a;
    pfStack_2118 = (fdb_kvs_handle *)0x112701;
    fdb_kvs_close(pfStack_20d8);
    pfStack_2118 = (fdb_kvs_handle *)0x11270b;
    fdb_kvs_close(pfStack_20e0);
    pfStack_2118 = (fdb_kvs_handle *)0x112715;
    fdb_kvs_close(pfStack_20e8);
    pfStack_2118 = (fdb_kvs_handle *)0x112724;
    fVar5 = fdb_commit(pfStack_2100,'\x01');
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_2118 = (fdb_kvs_handle *)0x112736;
      fdb_kvs_close(pfStack_20c0);
      pfStack_2118 = (fdb_kvs_handle *)0x112740;
      fdb_kvs_close(pfStack_20c8);
      pfStack_2118 = (fdb_kvs_handle *)0x11274a;
      fdb_kvs_close(pfStack_20d0);
      pfStack_2118 = (fdb_kvs_handle *)0x112754;
      fdb_kvs_close(pfStack_2108);
      pfStack_2118 = (fdb_kvs_handle *)0x11275e;
      fdb_close(pfStack_2100);
      pfStack_2118 = (fdb_kvs_handle *)0x112768;
      fdb_doc_free((fdb_doc *)aStack_20f8.seqtree);
      pfStack_2118 = (fdb_kvs_handle *)0x11276d;
      fdb_shutdown();
      pfStack_2118 = (fdb_kvs_handle *)0x112772;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (in_memory_snapshot_cleanup_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pfStack_2118 = (fdb_kvs_handle *)0x1127a3;
      fprintf(_stderr,pcVar15,"in-memory snapshot cleanup test");
      return;
    }
  }
  else {
    pfStack_2118 = (fdb_kvs_handle *)0x1127ba;
    in_memory_snapshot_cleanup_test();
LAB_001127ba:
    pfStack_2118 = (fdb_kvs_handle *)0x1127bf;
    in_memory_snapshot_cleanup_test();
LAB_001127bf:
    pfStack_2118 = (fdb_kvs_handle *)0x1127c4;
    in_memory_snapshot_cleanup_test();
LAB_001127c4:
    pfStack_2118 = (fdb_kvs_handle *)0x1127c9;
    in_memory_snapshot_cleanup_test();
LAB_001127c9:
    pfStack_2118 = (fdb_kvs_handle *)0x1127ce;
    in_memory_snapshot_cleanup_test();
LAB_001127ce:
    pfStack_2118 = (fdb_kvs_handle *)0x1127d3;
    in_memory_snapshot_cleanup_test();
LAB_001127d3:
    pfStack_2118 = (fdb_kvs_handle *)0x1127d8;
    in_memory_snapshot_cleanup_test();
LAB_001127d8:
    pfStack_2118 = (fdb_kvs_handle *)0x1127dd;
    in_memory_snapshot_cleanup_test();
LAB_001127dd:
    pfStack_2118 = (fdb_kvs_handle *)0x1127e2;
    in_memory_snapshot_cleanup_test();
LAB_001127e2:
    pfStack_2118 = (fdb_kvs_handle *)0x1127e7;
    in_memory_snapshot_cleanup_test();
LAB_001127e7:
    pfStack_2118 = (fdb_kvs_handle *)0x1127ec;
    in_memory_snapshot_cleanup_test();
LAB_001127ec:
    pfStack_2118 = (fdb_kvs_handle *)0x1127f1;
    in_memory_snapshot_cleanup_test();
LAB_001127f1:
    pfStack_2118 = (fdb_kvs_handle *)0x1127f6;
    in_memory_snapshot_cleanup_test();
LAB_001127f6:
    pfStack_2118 = (fdb_kvs_handle *)0x1127fb;
    in_memory_snapshot_cleanup_test();
LAB_001127fb:
    pfStack_2118 = (fdb_kvs_handle *)0x112800;
    in_memory_snapshot_cleanup_test();
LAB_00112800:
    pfStack_2118 = (fdb_kvs_handle *)0x112805;
    in_memory_snapshot_cleanup_test();
LAB_00112805:
    pfStack_2118 = (fdb_kvs_handle *)0x11280a;
    in_memory_snapshot_cleanup_test();
LAB_0011280a:
    pfStack_2118 = (fdb_kvs_handle *)0x11280f;
    in_memory_snapshot_cleanup_test();
  }
  pfStack_2118 = (fdb_kvs_handle *)in_memory_snapshot_on_dirty_hbtrie_test;
  in_memory_snapshot_cleanup_test();
  pfStack_24e0 = (fdb_kvs_handle *)0x112834;
  paStack_2140 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar29;
  pfStack_2138 = (fdb_kvs_handle *)pcVar16;
  pfStack_2130 = (fdb_kvs_handle *)unaff_R13;
  pfStack_2128 = pfVar17;
  pfStack_2120 = (fdb_kvs_handle *)handle_00;
  pfStack_2118 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday(&tStack_2458,(__timezone_ptr_t)0x0);
  pfStack_2248 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_2240,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_24e0 = (fdb_kvs_handle *)0x11285c;
  system((char *)&pfStack_2248);
  pfStack_24e0 = (fdb_kvs_handle *)0x112861;
  memleak_start();
  pfStack_24e0 = (fdb_kvs_handle *)0x11286b;
  pfVar17 = (fdb_kvs_handle *)malloc(0x20);
  pcVar29 = auStack_2448 + 0x108;
  pfStack_24e0 = (fdb_kvs_handle *)0x11287e;
  fdb_get_default_config();
  uStack_2320._0_1_ = true;
  uStack_2320._1_1_ = true;
  uStack_2328 = '\x01';
  pcStack_2330 = (char *)0x3c;
  uStack_2300 = 1;
  sStack_2338 = 0;
  pfStack_24e0 = (fdb_kvs_handle *)0x1128a9;
  fdb_get_default_kvs_config();
  pfStack_24e0 = (fdb_kvs_handle *)0x1128bd;
  fVar5 = fdb_open(&pfStack_2490,"./mvcc_test",(fdb_config *)pcVar29);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pcVar15 = auStack_2478 + 8;
    pfStack_24e0 = (fdb_kvs_handle *)0x1128e0;
    fVar5 = fdb_kvs_open(pfStack_2490,&pfStack_24a8,"db",(fdb_kvs_config *)pcVar15);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130d7;
    puStack_24b0 = (undefined4 *)
                   ((long)&(((atomic<unsigned_long> *)&pfVar17->kvs)->
                           super___atomic_base<unsigned_long>)._M_i + 2);
    pcVar29 = "k%05d";
    handle_00 = auStack_2448;
    pcVar16 = "value%08d";
    handle._M_i = 0;
    do {
      pfStack_24e0 = (fdb_kvs_handle *)0x11291b;
      sprintf(handle_00,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar17->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar17->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)
       &(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
        super___atomic_base<unsigned_long>)._M_i = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 4) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp_param)->
               super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp_param)->
               super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
      *(undefined2 *)(puStack_24b0 + 1) = 0x3e;
      *puStack_24b0 = 0x646e653c;
      pfStack_24e0 = (fdb_kvs_handle *)0x112949;
      sprintf((char *)pfVar17,"value%08d",handle._M_i);
      unaff_R13 = (char *)pfStack_24a8;
      pfStack_24e0 = (fdb_kvs_handle *)0x112956;
      sVar8 = strlen(handle_00);
      pfStack_24e0 = (fdb_kvs_handle *)0x11296e;
      pcVar15 = (char *)pfVar17;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle_00,sVar8 + 1,pfVar17,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113057;
      uVar20 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar20;
    } while (uVar20 != 0x1e);
    pfStack_24e0 = (fdb_kvs_handle *)0x11298c;
    fVar5 = fdb_commit(pfStack_2490,'\x01');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130dc;
    pfStack_24e0 = (fdb_kvs_handle *)0x1129aa;
    fVar5 = fdb_snapshot_open(pfStack_24a8,&pfStack_24b8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130e1;
    pfStack_24e0 = (fdb_kvs_handle *)0x1129c8;
    fVar5 = fdb_snapshot_open(pfStack_24b8,&pfStack_24a0,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130e6;
    handle._M_i = 0x1e;
    handle_00 = auStack_2448;
    pcVar16 = "value%08d";
    do {
      pfStack_24e0 = (fdb_kvs_handle *)0x1129fa;
      sprintf(handle_00,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar17->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar17->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)
       &(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
        super___atomic_base<unsigned_long>)._M_i = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 4) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp_param)->
               super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp_param)->
               super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
      *(undefined2 *)(puStack_24b0 + 1) = 0x3e;
      *puStack_24b0 = 0x646e653c;
      pfStack_24e0 = (fdb_kvs_handle *)0x112a28;
      sprintf((char *)pfVar17,"value%08d",handle._M_i);
      unaff_R13 = (char *)pfStack_24a8;
      pfStack_24e0 = (fdb_kvs_handle *)0x112a35;
      sVar8 = strlen(handle_00);
      pfStack_24e0 = (fdb_kvs_handle *)0x112a4d;
      pcVar15 = (char *)pfVar17;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle_00,sVar8 + 1,pfVar17,0x20);
      pfVar12 = (fdb_kvs_handle *)"k%05d";
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011305c;
      uVar20 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar20;
    } while (uVar20 != 300);
    pfStack_24e0 = (fdb_kvs_handle *)0x112a7d;
    sprintf((char *)auStack_2448,"k%05d",0x1e);
    handle_00 = (char *)pfStack_24b8;
    pfStack_24e0 = (fdb_kvs_handle *)0x112a8a;
    sVar8 = strlen((char *)auStack_2448);
    pcVar15 = auStack_2478;
    pfStack_24e0 = (fdb_kvs_handle *)0x112aa3;
    fVar5 = fdb_get_kv((fdb_kvs_handle *)handle_00,(fdb_kvs_handle *)auStack_2448,sVar8 + 1,
                       (void **)pcVar15,&sStack_2480);
    pfVar12 = pfStack_24a0;
    pcVar29 = (char *)auStack_2448;
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_001130eb;
    handle_00 = auStack_2448;
    pfStack_24e0 = (fdb_kvs_handle *)0x112ac0;
    sVar8 = strlen(handle_00);
    pcVar15 = auStack_2478;
    pfStack_24e0 = (fdb_kvs_handle *)0x112ad9;
    fVar5 = fdb_get_kv(pfVar12,handle_00,sVar8 + 1,(void **)pcVar15,&sStack_2480);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_001130f0;
    pfStack_24e0 = (fdb_kvs_handle *)0x112aeb;
    fVar5 = fdb_kvs_close(pfStack_24b8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130f5;
    pfStack_24e0 = (fdb_kvs_handle *)0x112afd;
    fVar5 = fdb_kvs_close(pfStack_24a0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130fa;
    pfStack_24e0 = (fdb_kvs_handle *)0x112b1b;
    fVar5 = fdb_snapshot_open(pfStack_24a8,&pfStack_24b8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130ff;
    pcVar15 = (char *)0x0;
    pfStack_24e0 = (fdb_kvs_handle *)0x112b43;
    fVar5 = fdb_iterator_init(pfStack_24b8,&pfStack_24c0,(void *)0x0,0,(void *)0x0,0,0);
    pcVar29 = (char *)pfVar12;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113104;
    pcVar16 = auStack_2448;
    unaff_R13 = "value%08d";
    handle._M_i = 0;
    do {
      pfStack_24d0 = (fdb_kvs_handle *)0x0;
      pfStack_24e0 = (fdb_kvs_handle *)0x112b74;
      fVar5 = fdb_iterator_get(pfStack_24c0,(fdb_doc **)&pfStack_24d0);
      pcVar29 = (char *)pfVar12;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      pfStack_24e0 = (fdb_kvs_handle *)0x112b8f;
      sprintf(pcVar16,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar17->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar17->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)
       &(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
        super___atomic_base<unsigned_long>)._M_i = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 4) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp_param)->
               super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp_param)->
               super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
      *(undefined2 *)(puStack_24b0 + 1) = 0x3e;
      *puStack_24b0 = 0x646e653c;
      pfStack_24e0 = (fdb_kvs_handle *)0x112bbd;
      sprintf((char *)pfVar17,"value%08d",handle._M_i);
      pfVar12 = pfStack_24d0;
      handle_00 = (char *)pfStack_24d0->op_stats;
      pfStack_24e0 = (fdb_kvs_handle *)0x112bd4;
      iVar6 = bcmp(handle_00,pcVar16,*(size_t *)&pfStack_24d0->kvs_config);
      if (iVar6 != 0) goto LAB_00113061;
      handle_00 = (char *)(pfVar12->field_6).seqtree;
      pfStack_24e0 = (fdb_kvs_handle *)0x112bef;
      iVar6 = bcmp(handle_00,pfVar17,(size_t)(pfVar12->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_00113071;
      handle._M_i = (__int_type)((int)handle._M_i + 1);
      pfStack_24e0 = (fdb_kvs_handle *)0x112c01;
      fdb_doc_free((fdb_doc *)pfVar12);
      pfStack_24e0 = (fdb_kvs_handle *)0x112c0b;
      fVar5 = fdb_iterator_next(pfStack_24c0);
      pcVar29 = (char *)pfVar12;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)handle._M_i != 300) goto LAB_00113109;
    pfStack_24e0 = (fdb_kvs_handle *)0x112c29;
    fVar5 = fdb_iterator_close(pfStack_24c0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011310e;
    pfStack_24e0 = (fdb_kvs_handle *)0x112c47;
    fVar5 = fdb_snapshot_open(pfStack_24b8,&pfStack_24a0,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113113;
    pcVar15 = (char *)0x0;
    pfStack_24e0 = (fdb_kvs_handle *)0x112c6f;
    fVar5 = fdb_iterator_init(pfStack_24b8,&pfStack_24c0,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113118;
    pcVar15 = (char *)0x0;
    pfStack_24e0 = (fdb_kvs_handle *)0x112c97;
    fVar5 = fdb_iterator_init(pfStack_24a0,&pfStack_2488,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011311d;
    pcVar15 = (char *)0x0;
    pfStack_24e0 = (fdb_kvs_handle *)0x112cbf;
    fVar5 = fdb_iterator_init(pfStack_24a8,&pfStack_2498,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113122;
    pcVar16 = auStack_2448;
    unaff_R13 = "value%08d";
    handle_00 = "k%06d";
    uStack_24c4 = 0;
    do {
      pfStack_24d0 = (fdb_kvs_handle *)0x0;
      pfStack_24e0 = (fdb_kvs_handle *)0x112cfd;
      fVar5 = fdb_iterator_get(pfStack_24c0,(fdb_doc **)&pfStack_24d0);
      uVar20 = uStack_24c4;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112ea7;
      pfStack_24e0 = (fdb_kvs_handle *)0x112d1c;
      sprintf(pcVar16,"k%05d",(ulong)uStack_24c4);
      *(undefined4 *)&pfVar17->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar17->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)
       &(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
        super___atomic_base<unsigned_long>)._M_i = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 4) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp_param)->
               super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp_param)->
               super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
      *(undefined2 *)(puStack_24b0 + 1) = 0x3e;
      *puStack_24b0 = 0x646e653c;
      pfStack_24e0 = (fdb_kvs_handle *)0x112d4a;
      sprintf((char *)pfVar17,"value%08d",(ulong)uVar20);
      pfVar12 = pfStack_24d0;
      handle._M_i = (__int_type)pfStack_24d0->op_stats;
      pfStack_24e0 = (fdb_kvs_handle *)0x112d61;
      iVar6 = bcmp((void *)handle._M_i,pcVar16,*(size_t *)&pfStack_24d0->kvs_config);
      if (iVar6 != 0) goto LAB_0011307c;
      handle._M_i = (__int_type)(pfVar12->field_6).seqtree;
      pfStack_24e0 = (fdb_kvs_handle *)0x112d7c;
      iVar6 = bcmp((void *)handle._M_i,pfVar17,(size_t)(pfVar12->kvs_config).custom_cmp_param);
      pcVar29 = (char *)pfVar12;
      if (iVar6 != 0) goto LAB_001130ac;
      pfStack_24e0 = (fdb_kvs_handle *)0x112d8c;
      fdb_doc_free((fdb_doc *)pfVar12);
      pfStack_24d0 = (fdb_kvs_handle *)0x0;
      pfStack_24e0 = (fdb_kvs_handle *)0x112da4;
      fVar5 = fdb_iterator_get(pfStack_24c0,(fdb_doc **)&pfStack_24d0);
      pcVar29 = (char *)pfStack_24d0;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011308c;
      handle._M_i = (__int_type)pfStack_24d0->op_stats;
      pfStack_24e0 = (fdb_kvs_handle *)0x112dc3;
      iVar6 = bcmp((void *)handle._M_i,pcVar16,*(size_t *)&pfStack_24d0->kvs_config);
      if (iVar6 != 0) goto LAB_00113091;
      handle._M_i = (__int_type)(((fdb_kvs_handle *)pcVar29)->field_6).seqtree;
      pfStack_24e0 = (fdb_kvs_handle *)0x112dde;
      iVar6 = bcmp((void *)handle._M_i,pfVar17,
                   (size_t)(((fdb_kvs_handle *)pcVar29)->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_001130a1;
      uVar20 = uStack_24c4 + 1;
      pfStack_24e0 = (fdb_kvs_handle *)0x112df4;
      fdb_doc_free((fdb_doc *)pcVar29);
      uStack_24c4 = uVar20;
      if (uVar20 == 0x3c) {
        pcVar29 = (char *)0x0;
        do {
          pfStack_24e0 = (fdb_kvs_handle *)0x112e10;
          sprintf(pcVar16,"k%06d",pcVar29);
          *(undefined4 *)&pfVar17->kvs_config = 0x78787878;
          *(undefined4 *)&(pfVar17->kvs_config).field_0x4 = 0x78787878;
          *(undefined4 *)
           &(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
            super___atomic_base<unsigned_long>)._M_i = 0x78787878;
          *(undefined4 *)
           ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
                   super___atomic_base<unsigned_long>)._M_i + 4) = 0x78787878;
          *(undefined4 *)
           ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
                   super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
          *(undefined4 *)
           ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
                   super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
          *(undefined4 *)
           ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp_param)->
                   super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
          *(undefined4 *)
           ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp_param)->
                   super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
          *(undefined2 *)(puStack_24b0 + 1) = 0x3e;
          *puStack_24b0 = 0x646e653c;
          pfStack_24e0 = (fdb_kvs_handle *)0x112e3f;
          sprintf((char *)pfVar17,"value%08d",pcVar29);
          handle._M_i = (__int_type)pfStack_24a8;
          pfStack_24e0 = (fdb_kvs_handle *)0x112e4c;
          sVar8 = strlen(pcVar16);
          pfStack_24e0 = (fdb_kvs_handle *)0x112e64;
          pcVar15 = (char *)pfVar17;
          fVar5 = fdb_set_kv((fdb_kvs_handle *)handle._M_i,pcVar16,sVar8 + 1,pfVar17,0x20);
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pfStack_24e0 = (fdb_kvs_handle *)0x113057;
            in_memory_snapshot_on_dirty_hbtrie_test();
            goto LAB_00113057;
          }
          uVar20 = (int)pcVar29 + 1;
          pcVar29 = (char *)(ulong)uVar20;
        } while (uVar20 != 3000);
      }
      pfStack_24e0 = (fdb_kvs_handle *)0x112e82;
      fVar7 = fdb_iterator_next(pfStack_24c0);
      handle._M_i = (__int_type)(uint)fVar7;
      pfStack_24e0 = (fdb_kvs_handle *)0x112e8e;
      fVar5 = fdb_iterator_next(pfStack_2488);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00112e9f;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    pfStack_24e0 = (fdb_kvs_handle *)0x112e9f;
    in_memory_snapshot_on_dirty_hbtrie_test();
    fVar5 = extraout_EAX;
LAB_00112e9f:
    if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00112ea7:
      if (uStack_24c4 != 300) goto LAB_00113127;
      pfStack_24e0 = (fdb_kvs_handle *)0x112ebf;
      fVar5 = fdb_iterator_close(pfStack_24c0);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011312c;
      pfStack_24e0 = (fdb_kvs_handle *)0x112ed1;
      fVar5 = fdb_iterator_close(pfStack_2488);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113131;
      pcVar16 = auStack_2448;
      unaff_R13 = "value%08d";
      handle._M_i = 0;
      do {
        pfStack_24d0 = (fdb_kvs_handle *)0x0;
        pfStack_24e0 = (fdb_kvs_handle *)0x112f02;
        fVar5 = fdb_iterator_get(pfStack_2498,(fdb_doc **)&pfStack_24d0);
        if (fVar5 != FDB_RESULT_SUCCESS) break;
        pfStack_24e0 = (fdb_kvs_handle *)0x112f1d;
        sprintf(pcVar16,"k%05d",handle._M_i);
        *(undefined4 *)&pfVar17->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar17->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)
         &(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
          super___atomic_base<unsigned_long>)._M_i = 0x78787878;
        *(undefined4 *)
         ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
                 super___atomic_base<unsigned_long>)._M_i + 4) = 0x78787878;
        *(undefined4 *)
         ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
                 super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
        *(undefined4 *)
         ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp)->
                 super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
        *(undefined4 *)
         ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp_param)->
                 super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
        *(undefined4 *)
         ((long)&(((atomic<unsigned_long> *)&(pfVar17->kvs_config).custom_cmp_param)->
                 super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
        *(undefined2 *)(puStack_24b0 + 1) = 0x3e;
        *puStack_24b0 = 0x646e653c;
        pfStack_24e0 = (fdb_kvs_handle *)0x112f4b;
        sprintf((char *)pfVar17,"value%08d",handle._M_i);
        pcVar29 = (char *)pfStack_24d0;
        handle_00 = (char *)pfStack_24d0->op_stats;
        pfStack_24e0 = (fdb_kvs_handle *)0x112f62;
        iVar6 = bcmp(handle_00,pcVar16,*(size_t *)&pfStack_24d0->kvs_config);
        if (iVar6 != 0) goto LAB_001130b7;
        handle_00 = (char *)(((fdb_kvs_handle *)pcVar29)->field_6).seqtree;
        pfStack_24e0 = (fdb_kvs_handle *)0x112f7d;
        iVar6 = bcmp(handle_00,pfVar17,
                     (size_t)(((fdb_kvs_handle *)pcVar29)->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_001130c7;
        handle._M_i = (__int_type)((int)handle._M_i + 1);
        pfStack_24e0 = (fdb_kvs_handle *)0x112f8f;
        fdb_doc_free((fdb_doc *)pcVar29);
        pfStack_24e0 = (fdb_kvs_handle *)0x112f99;
        fVar5 = fdb_iterator_next(pfStack_2498);
      } while (fVar5 == FDB_RESULT_SUCCESS);
      if ((int)handle._M_i != 300) goto LAB_00113136;
      pfStack_24e0 = (fdb_kvs_handle *)0x112fb7;
      fVar5 = fdb_iterator_close(pfStack_2498);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011313b;
      pfStack_24e0 = (fdb_kvs_handle *)0x112fc9;
      fVar5 = fdb_kvs_close(pfStack_24b8);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113140;
      pfStack_24e0 = (fdb_kvs_handle *)0x112fdb;
      fVar5 = fdb_kvs_close(pfStack_24a0);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113145;
      pfStack_24e0 = (fdb_kvs_handle *)0x112fed;
      fVar5 = fdb_close(pfStack_2490);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011314a;
      pfStack_24e0 = (fdb_kvs_handle *)0x112ffa;
      fVar5 = fdb_shutdown();
      if (fVar5 == FDB_RESULT_SUCCESS) {
        pfStack_24e0 = (fdb_kvs_handle *)0x11300a;
        free(pfVar17);
        pfStack_24e0 = (fdb_kvs_handle *)0x11300f;
        memleak_end();
        pcVar15 = "%s PASSED\n";
        if (in_memory_snapshot_on_dirty_hbtrie_test()::__test_pass != '\0') {
          pcVar15 = "%s FAILED\n";
        }
        pfStack_24e0 = (fdb_kvs_handle *)0x113040;
        fprintf(_stderr,pcVar15,"in-memory snapshot on dirty HB+trie nodes test");
        return;
      }
      goto LAB_0011314f;
    }
  }
  else {
LAB_001130d2:
    pfStack_24e0 = (fdb_kvs_handle *)0x1130d7;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130d7:
    pfStack_24e0 = (fdb_kvs_handle *)0x1130dc;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130dc:
    pfStack_24e0 = (fdb_kvs_handle *)0x1130e1;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130e1:
    pfStack_24e0 = (fdb_kvs_handle *)0x1130e6;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130e6:
    pfStack_24e0 = (fdb_kvs_handle *)0x1130eb;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130eb:
    pfVar12 = (fdb_kvs_handle *)pcVar29;
    pfStack_24e0 = (fdb_kvs_handle *)0x1130f0;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130f0:
    pfStack_24e0 = (fdb_kvs_handle *)0x1130f5;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130f5:
    pfStack_24e0 = (fdb_kvs_handle *)0x1130fa;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130fa:
    pfStack_24e0 = (fdb_kvs_handle *)0x1130ff;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130ff:
    pfStack_24e0 = (fdb_kvs_handle *)0x113104;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pcVar29 = (char *)pfVar12;
LAB_00113104:
    pfStack_24e0 = (fdb_kvs_handle *)0x113109;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113109:
    pfStack_24e0 = (fdb_kvs_handle *)0x11310e;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011310e:
    pfStack_24e0 = (fdb_kvs_handle *)0x113113;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113113:
    pfStack_24e0 = (fdb_kvs_handle *)0x113118;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113118:
    pfStack_24e0 = (fdb_kvs_handle *)0x11311d;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011311d:
    pfStack_24e0 = (fdb_kvs_handle *)0x113122;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113122:
    pfStack_24e0 = (fdb_kvs_handle *)0x113127;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113127:
    pfStack_24e0 = (fdb_kvs_handle *)0x11312c;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011312c:
    pfStack_24e0 = (fdb_kvs_handle *)0x113131;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113131:
    pfStack_24e0 = (fdb_kvs_handle *)0x113136;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113136:
    pfStack_24e0 = (fdb_kvs_handle *)0x11313b;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011313b:
    pfStack_24e0 = (fdb_kvs_handle *)0x113140;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113140:
    pfStack_24e0 = (fdb_kvs_handle *)0x113145;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113145:
    pfStack_24e0 = (fdb_kvs_handle *)0x11314a;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011314a:
    pfStack_24e0 = (fdb_kvs_handle *)0x11314f;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011314f:
    pfStack_24e0 = (fdb_kvs_handle *)0x113154;
    in_memory_snapshot_on_dirty_hbtrie_test();
  }
  pfStack_24e0 = (fdb_kvs_handle *)in_memory_snapshot_compaction_test;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfStack_28f8 = (fdb_kvs_handle *)0x113179;
  pfStack_2508 = pfVar17;
  pfStack_2500 = (fdb_kvs_handle *)pcVar16;
  pfStack_24f8 = (fdb_kvs_handle *)unaff_R13;
  pfStack_24f0 = (fdb_kvs_handle *)pcVar29;
  pfStack_24e8 = (fdb_kvs_handle *)handle_00;
  pfStack_24e0 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday(&tStack_2820,(__timezone_ptr_t)0x0);
  auStack_28e8._4_2_ = 100;
  auStack_28e8._0_4_ = 0x3530256b;
  auStack_28c0._8_2_ = 100;
  auStack_28c0._0_8_ = 0x38302565756c6176;
  builtin_strncpy(acStack_2608,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_2610 = (fdb_kvs_handle *)0x202066722d206d72;
  pfStack_28f8 = (fdb_kvs_handle *)0x1131c6;
  system((char *)&pfStack_2610);
  pfStack_28f8 = (fdb_kvs_handle *)0x1131cb;
  memleak_start();
  pfStack_28f8 = (fdb_kvs_handle *)0x1131d5;
  pfVar12 = (fdb_kvs_handle *)malloc(0x20);
  pfVar17 = (fdb_kvs_handle *)((long)apbStack_2810 + 0x108);
  pfStack_28f8 = (fdb_kvs_handle *)0x1131e8;
  fdb_get_default_config();
  uStack_26e8 = 0x201;
  auStack_2708[0x18] = '\x01';
  auStack_2708._16_8_ = (fdb_txn *)0x2;
  uStack_26c8 = 1;
  auStack_2708._8_8_ = (fdb_log_callback)0x0;
  pcStack_26b0 = cb_inmem_snap;
  uStack_26a8 = 2;
  pfStack_26a0 = (fdb_txn *)auStack_2890;
  pfStack_28f8 = (fdb_kvs_handle *)0x113232;
  fdb_get_default_kvs_config();
  pfStack_28f8 = (fdb_kvs_handle *)0x113246;
  fVar5 = fdb_open(&pfStack_28e0,"./mvcc_test",(fdb_config *)pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pcVar15 = auStack_2890 + 0x28;
    pfStack_28f8 = (fdb_kvs_handle *)0x11326c;
    fVar5 = fdb_kvs_open(pfStack_28e0,(fdb_kvs_handle **)(auStack_28c0 + 0x10),"db",
                         (fdb_kvs_config *)pcVar15);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011364f;
    pcVar15 = auStack_2890 + 0x28;
    pfStack_28f8 = (fdb_kvs_handle *)0x113292;
    fVar5 = fdb_kvs_open(pfStack_28e0,(fdb_kvs_handle **)(auStack_28c0 + 0x18),"db",
                         (fdb_kvs_config *)pcVar15);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113654;
    auStack_2890._0_8_ = auStack_28c0._24_8_;
    auStack_2890._8_8_ = (btree *)0xa;
    auStack_2890._24_8_ = auStack_28e8;
    handle_00 = auStack_28c0;
    auStack_2890._16_4_ = 0x20;
    pfVar17 = (fdb_kvs_handle *)
              ((long)&(((atomic<unsigned_long> *)&pfVar12->kvs)->super___atomic_base<unsigned_long>)
                      ._M_i + 2);
    pcVar16 = (char *)apbStack_2810;
    handle._M_i = 0;
    auStack_2890._32_8_ = handle_00;
    do {
      pfStack_28f8 = (fdb_kvs_handle *)0x1132ee;
      sprintf(pcVar16,auStack_28e8,handle._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)
       &(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
        super___atomic_base<unsigned_long>)._M_i = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 4) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
               super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp_param)->
               super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
      *(undefined4 *)
       ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp_param)->
               super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
      *(undefined2 *)
       ((long)&(((atomic<unsigned_long> *)&pfVar12->kvs)->super___atomic_base<unsigned_long>)._M_i +
       6) = 0x3e;
      *(undefined4 *)&pfVar17->kvs_config = 0x646e653c;
      pfStack_28f8 = (fdb_kvs_handle *)0x113319;
      sprintf((char *)pfVar12,handle_00,handle._M_i);
      unaff_R13 = (char *)auStack_28c0._16_8_;
      pfStack_28f8 = (fdb_kvs_handle *)0x113326;
      sVar8 = strlen(pcVar16);
      pfStack_28f8 = (fdb_kvs_handle *)0x11333e;
      pcVar15 = (char *)pfVar12;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,pcVar16,sVar8 + 1,pfVar12,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_28f8 = (fdb_kvs_handle *)0x113614;
        in_memory_snapshot_compaction_test();
        goto LAB_00113614;
      }
      uVar20 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar20;
    } while (uVar20 != 10);
    pfStack_28f8 = (fdb_kvs_handle *)0x11335c;
    fVar5 = fdb_commit(pfStack_28e0,'\x01');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113659;
    pfStack_28f8 = (fdb_kvs_handle *)0x113375;
    fVar5 = fdb_compact(pfStack_28e0,"./mvcc_test2");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011365e;
    pfStack_28f8 = (fdb_kvs_handle *)0x113393;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_28c0._16_8_,&pfStack_28d8,0xffffffffffffffff
                             );
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113663;
    pfStack_28f8 = (fdb_kvs_handle *)0x1133ad;
    fVar5 = fdb_get_kvs_info(pfStack_28d8,(fdb_kvs_info *)&phStack_2850);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113668;
    if (pkStack_2848 != (kvs_ops_stat *)0xb) {
      pfStack_28f8 = (fdb_kvs_handle *)0x1133cd;
      in_memory_snapshot_compaction_test();
    }
    pcVar15 = (char *)0x0;
    pfStack_28f8 = (fdb_kvs_handle *)0x1133ed;
    fVar5 = fdb_iterator_init(pfStack_28d8,&pfStack_28c8,(void *)0x0,0,(void *)0x0,0,0);
    pfVar22 = (fdb_kvs_handle *)pcVar16;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011366d;
    handle_00 = (char *)apbStack_2810;
    handle._M_i = 0;
    do {
      pfStack_28d0 = (fdb_kvs_handle *)0x0;
      pfStack_28f8 = (fdb_kvs_handle *)0x113417;
      fVar5 = fdb_iterator_get(pfStack_28c8,(fdb_doc **)&pfStack_28d0);
      pcVar16 = (char *)pfStack_28d0;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      if ((uint)handle._M_i < 10) {
        pfStack_28f8 = (fdb_kvs_handle *)0x113435;
        sprintf(handle_00,auStack_28e8,handle._M_i);
        *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)
         &(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
          super___atomic_base<unsigned_long>)._M_i = 0x78787878;
        *(undefined4 *)
         ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
                 super___atomic_base<unsigned_long>)._M_i + 4) = 0x78787878;
        *(undefined4 *)
         ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
                 super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
        *(undefined4 *)
         ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
                 super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
        *(undefined4 *)
         ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp_param)->
                 super___atomic_base<unsigned_long>)._M_i + 2) = 0x78787878;
        *(undefined4 *)
         ((long)&(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp_param)->
                 super___atomic_base<unsigned_long>)._M_i + 6) = 0x78787878;
        *(undefined2 *)
         ((long)&(((atomic<unsigned_long> *)&pfVar12->kvs)->super___atomic_base<unsigned_long>)._M_i
         + 6) = 0x3e;
        *(undefined4 *)&pfVar17->kvs_config = 0x646e653c;
        pfStack_28f8 = (fdb_kvs_handle *)0x113462;
        sprintf((char *)pfVar12,auStack_28c0,handle._M_i);
        pcVar16 = (char *)pfStack_28d0;
        unaff_R13 = (char *)(((atomic<unsigned_long> *)&pfStack_28d0->op_stats)->
                            super___atomic_base<unsigned_long>)._M_i;
        pfStack_28f8 = (fdb_kvs_handle *)0x11347b;
        iVar6 = bcmp(unaff_R13,handle_00,
                     (__int_type)*(__atomic_base<unsigned_long> *)&pfStack_28d0->kvs_config);
        if (iVar6 != 0) goto LAB_0011362f;
        unaff_R13 = (char *)(((fdb_kvs_handle *)pcVar16)->field_6).seqtree;
        pfStack_28f8 = (fdb_kvs_handle *)0x113498;
        iVar6 = bcmp(unaff_R13,pfVar12,
                     (((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)pcVar16)->kvs_config).custom_cmp_param)->
                     super___atomic_base<unsigned_long>)._M_i);
        if (iVar6 != 0) goto LAB_0011363f;
      }
      else {
        apbStack_2810[0] = (btreeblk_handle *)0x79656b5f77656e;
        *(__atomic_base<unsigned_long> *)&pfVar12->kvs_config =
             (__atomic_base<unsigned_long>)0x756c61765f77656e;
        *(undefined2 *)
         &(((atomic<unsigned_long> *)&(pfVar12->kvs_config).custom_cmp)->
          super___atomic_base<unsigned_long>)._M_i = 0x65;
        unaff_R13 = (char *)(((atomic<unsigned_long> *)&pfStack_28d0->op_stats)->
                            super___atomic_base<unsigned_long>)._M_i;
        pfStack_28f8 = (fdb_kvs_handle *)0x1134df;
        iVar6 = bcmp(unaff_R13,handle_00,
                     (__int_type)*(__atomic_base<unsigned_long> *)&pfStack_28d0->kvs_config);
        if (iVar6 != 0) goto LAB_00113614;
        unaff_R13 = (char *)(((fdb_kvs_handle *)pcVar16)->field_6).seqtree;
        pfStack_28f8 = (fdb_kvs_handle *)0x1134fc;
        iVar6 = bcmp(unaff_R13,pfVar12,
                     (((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)pcVar16)->kvs_config).custom_cmp_param)->
                     super___atomic_base<unsigned_long>)._M_i);
        if (iVar6 != 0) goto LAB_00113624;
      }
      handle._M_i = (__int_type)((uint)handle._M_i + 1);
      pfStack_28f8 = (fdb_kvs_handle *)0x11350e;
      fdb_doc_free((fdb_doc *)pcVar16);
      pfStack_28f8 = (fdb_kvs_handle *)0x113518;
      fVar5 = fdb_iterator_next(pfStack_28c8);
      pfVar22 = (fdb_kvs_handle *)pcVar16;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)handle._M_i != 0xb) goto LAB_00113672;
    pfStack_28f8 = (fdb_kvs_handle *)0x113533;
    fVar5 = fdb_iterator_close(pfStack_28c8);
    pfVar13 = pfStack_28d8;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113677;
    handle_00 = (char *)apbStack_2810;
    pfStack_28f8 = (fdb_kvs_handle *)0x113550;
    sVar8 = strlen(handle_00);
    pcVar15 = auStack_28c0 + 0x28;
    pfStack_28f8 = (fdb_kvs_handle *)0x113569;
    fVar5 = fdb_get_kv(pfVar13,handle_00,sVar8 + 1,(void **)pcVar15,(size_t *)(auStack_28c0 + 0x20))
    ;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011367c;
    pfStack_28f8 = (fdb_kvs_handle *)0x113586;
    pfVar17 = pfVar12;
    iVar6 = bcmp((void *)auStack_28c0._40_8_,pfVar12,auStack_28c0._32_8_);
    pfVar13 = (fdb_kvs_handle *)auStack_28c0._40_8_;
    if (iVar6 != 0) goto LAB_00113681;
    pfStack_28f8 = (fdb_kvs_handle *)0x113596;
    fdb_free_block((void *)auStack_28c0._40_8_);
    pfStack_28f8 = (fdb_kvs_handle *)0x1135a0;
    fdb_kvs_close(pfStack_28d8);
    pfStack_28f8 = (fdb_kvs_handle *)0x1135aa;
    fVar5 = fdb_close(pfStack_28e0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011368c;
    pfStack_28f8 = (fdb_kvs_handle *)0x1135b7;
    fVar5 = fdb_shutdown();
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_28f8 = (fdb_kvs_handle *)0x1135c7;
      free(pfVar12);
      pfStack_28f8 = (fdb_kvs_handle *)0x1135cc;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (in_memory_snapshot_compaction_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pfStack_28f8 = (fdb_kvs_handle *)0x1135fd;
      fprintf(_stderr,pcVar15,"in-memory snapshot with concurrent compaction test");
      return;
    }
  }
  else {
LAB_0011364a:
    pfStack_28f8 = (fdb_kvs_handle *)0x11364f;
    in_memory_snapshot_compaction_test();
LAB_0011364f:
    pfStack_28f8 = (fdb_kvs_handle *)0x113654;
    in_memory_snapshot_compaction_test();
LAB_00113654:
    pfStack_28f8 = (fdb_kvs_handle *)0x113659;
    in_memory_snapshot_compaction_test();
LAB_00113659:
    pfStack_28f8 = (fdb_kvs_handle *)0x11365e;
    in_memory_snapshot_compaction_test();
LAB_0011365e:
    pfStack_28f8 = (fdb_kvs_handle *)0x113663;
    in_memory_snapshot_compaction_test();
LAB_00113663:
    pfStack_28f8 = (fdb_kvs_handle *)0x113668;
    in_memory_snapshot_compaction_test();
LAB_00113668:
    pfStack_28f8 = (fdb_kvs_handle *)0x11366d;
    in_memory_snapshot_compaction_test();
    pfVar22 = (fdb_kvs_handle *)pcVar16;
LAB_0011366d:
    pfStack_28f8 = (fdb_kvs_handle *)0x113672;
    in_memory_snapshot_compaction_test();
LAB_00113672:
    pfStack_28f8 = (fdb_kvs_handle *)0x113677;
    in_memory_snapshot_compaction_test();
LAB_00113677:
    pfVar13 = pfVar17;
    pfStack_28f8 = (fdb_kvs_handle *)0x11367c;
    in_memory_snapshot_compaction_test();
LAB_0011367c:
    pfStack_28f8 = (fdb_kvs_handle *)0x113681;
    in_memory_snapshot_compaction_test();
LAB_00113681:
    pfStack_28f8 = (fdb_kvs_handle *)0x11368c;
    pfVar17 = pfVar13;
    in_memory_snapshot_compaction_test();
LAB_0011368c:
    pfStack_28f8 = (fdb_kvs_handle *)0x113691;
    in_memory_snapshot_compaction_test();
  }
  pfStack_28f8 = (fdb_kvs_handle *)cb_inmem_snap;
  in_memory_snapshot_compaction_test();
  uVar24 = (ulong)pfVar17 & 0xffffffff;
  pfVar14 = (fdb_kvs_handle *)0x0;
  pcStack_2bb0 = (code *)0x1136be;
  pfStack_2920 = pfVar12;
  pfStack_2918 = pfVar22;
  pfStack_2910 = (fdb_kvs_handle *)unaff_R13;
  pfStack_2908 = pfVar13;
  pfStack_2900 = (fdb_kvs_handle *)handle_00;
  pfStack_28f8 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)auStack_2b38,(__timezone_ptr_t)0x0);
  if ((int)pfVar17 != 2) {
    return;
  }
  __s_01 = extraout_RDX;
  if (extraout_RDX == (btree *)0x0) {
LAB_00113be0:
    pcStack_2bb0 = (code *)0x113be5;
    cb_inmem_snap();
LAB_00113be5:
    pcStack_2bb0 = (code *)0x113bea;
    cb_inmem_snap();
LAB_00113bea:
    pcStack_2bb0 = (code *)0x113bef;
    cb_inmem_snap();
LAB_00113bef:
    pcStack_2bb0 = (code *)0x113bf4;
    cb_inmem_snap();
LAB_00113bf4:
    pcStack_2bb0 = (code *)0x113bf9;
    cb_inmem_snap();
LAB_00113bf9:
    pcStack_2bb0 = (code *)0x113bfe;
    cb_inmem_snap();
LAB_00113bfe:
    pcStack_2bb0 = (code *)0x113c03;
    cb_inmem_snap();
    pfVar17 = (fdb_kvs_handle *)unaff_R13;
LAB_00113c03:
    pcStack_2bb0 = (code *)0x113c08;
    cb_inmem_snap();
LAB_00113c08:
    pfVar12 = (fdb_kvs_handle *)pcVar15;
    pcStack_2bb0 = (code *)0x113c0d;
    cb_inmem_snap();
LAB_00113c0d:
    pcStack_2bb0 = (code *)0x113c12;
    cb_inmem_snap();
  }
  else {
    unaff_R13 = (char *)CONCAT26(auStack_28e8._6_2_,CONCAT24(auStack_28e8._4_2_,auStack_28e8._0_4_))
    ;
    pfVar17 = (fdb_kvs_handle *)(ulong)*(byte *)&((fdb_kvs_handle *)pcVar15)->file;
    iVar6 = *(int *)((long)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp + 4);
    *(int *)((long)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp + 4) = iVar6 + 1;
    if (iVar6 != 4) {
      if (iVar6 != 1) {
        return;
      }
      pcStack_2bb0 = (code *)0x11370e;
      fVar5 = fdb_snapshot_open(*(fdb_kvs_handle **)&((fdb_kvs_handle *)unaff_R13)->kvs_config,
                                &pfStack_2b98,0xffffffffffffffff);
      pfVar14 = pfVar17;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113be5;
      pcStack_2bb0 = (code *)0x113725;
      fVar5 = fdb_get_kvs_info(pfStack_2b98,&fStack_2b68);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113bef;
      pcVar15 = (char *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp;
      if (fStack_2b68.last_seqnum !=
          (long)*(int *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp) {
        pcStack_2bb0 = (code *)0x113b4e;
        cb_inmem_snap();
      }
      pcStack_2bb0 = (code *)0x11376a;
      pfStack_2b88 = pfVar17;
      pp_Stack_2b80 = (fdb_custom_cmp_variable *)pcVar15;
      fVar5 = fdb_iterator_init(pfStack_2b98,&pfStack_2ba0,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar5 == FDB_RESULT_SUCCESS) {
        __s_01 = (btree *)(auStack_2b38 + 10);
        uVar24 = 0;
        do {
          pfStack_2b90 = (fdb_kvs_handle *)0x0;
          pcStack_2bb0 = (code *)0x1137a1;
          fVar5 = fdb_iterator_get(pfStack_2ba0,(fdb_doc **)&pfStack_2b90);
          if (fVar5 != FDB_RESULT_SUCCESS) break;
          lVar18 = CONCAT26(auStack_28e8._6_2_,CONCAT24(auStack_28e8._4_2_,auStack_28e8._0_4_));
          pcStack_2bb0 = (code *)0x1137c1;
          sprintf(auStack_2b28 + 0x100,*(char **)(lVar18 + 0x18),uVar24);
          sVar8 = (size_t)*(int *)(lVar18 + 0x10);
          pcStack_2bb0 = (code *)0x1137d5;
          memset(auStack_2b28,0x78,sVar8);
          *(undefined4 *)
           ((long)&(((atomic<unsigned_long> *)&__s_01->ksize)->super___atomic_base<unsigned_long>).
                   _M_i + sVar8) = 0x646e653c;
          *(undefined2 *)((long)&uStack_2b2a + sVar8) = 0x3e;
          pcStack_2bb0 = (code *)0x1137f5;
          sprintf(auStack_2b28,*(char **)(lVar18 + 0x20),uVar24);
          unaff_R13 = (char *)pfStack_2b90;
          pcVar15 = (char *)pfStack_2b90->op_stats;
          pcStack_2bb0 = (code *)0x11380d;
          iVar6 = bcmp(pcVar15,auStack_2b28 + 0x100,*(size_t *)&pfStack_2b90->kvs_config);
          if (iVar6 != 0) {
            pcStack_2bb0 = (code *)0x113b90;
            cb_inmem_snap();
LAB_00113b90:
            pcStack_2bb0 = (code *)0x113ba0;
            cb_inmem_snap();
            goto LAB_00113ba0;
          }
          pcVar15 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
          pcStack_2bb0 = (code *)0x113828;
          iVar6 = bcmp(pcVar15,auStack_2b28,
                       (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
          if (iVar6 != 0) goto LAB_00113b90;
          uVar24 = (ulong)((int)uVar24 + 1);
          pcStack_2bb0 = (code *)0x11383a;
          fdb_doc_free((fdb_doc *)unaff_R13);
          pcStack_2bb0 = (code *)0x113844;
          fVar5 = fdb_iterator_next(pfStack_2ba0);
        } while (fVar5 == FDB_RESULT_SUCCESS);
        if ((int)uVar24 != *(int *)pp_Stack_2b80) {
          pcStack_2bb0 = (code *)0x113b6c;
          cb_inmem_snap();
        }
        pcStack_2bb0 = (code *)0x113863;
        fVar5 = fdb_iterator_close(pfStack_2ba0);
        pfVar17 = pfStack_2b88;
        if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00113b21;
        pcStack_2bb0 = (code *)0x113875;
        cb_inmem_snap();
        goto LAB_00113875;
      }
      goto LAB_00113bf9;
    }
LAB_00113875:
    pcVar15 = auStack_2b28 + 0x100;
    auStack_2b28._256_4_ = 0x5f77656e;
    auStack_2b28[0x104] = 'k';
    auStack_2b28[0x105] = 'e';
    auStack_2b28[0x106] = 'y';
    auStack_2b28[0x107] = '\0';
    __s_01 = (btree *)auStack_2b28;
    auStack_2b28[0] = 'n';
    auStack_2b28[1] = 'e';
    auStack_2b28._2_2_ = 0x5f77;
    auStack_2b28._4_4_ = 0x756c6176;
    auStack_2b28._8_2_ = 0x65;
    pfVar14 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)unaff_R13)->kvs_config;
    pcStack_2bb0 = (code *)0x1138b7;
    pfStack_2b88 = pfVar17;
    sVar8 = strlen(pcVar15);
    pfVar22 = (fdb_kvs_handle *)(sVar8 + 1);
    pcStack_2bb0 = (code *)0x1138c3;
    sVar8 = strlen((char *)__s_01);
    pcStack_2bb0 = (code *)0x1138d8;
    fVar5 = fdb_set_kv(pfVar14,pcVar15,(size_t)pfVar22,__s_01,sVar8 + 1);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113bea;
    pcStack_2bb0 = (code *)0x1138f5;
    fVar5 = fdb_snapshot_open(*(fdb_kvs_handle **)&((fdb_kvs_handle *)unaff_R13)->kvs_config,
                              &pfStack_2b98,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113bf4;
    pcStack_2bb0 = (code *)0x11390c;
    fVar5 = fdb_get_kvs_info(pfStack_2b98,&fStack_2b68);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113bfe;
    pcVar15 = (char *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp;
    if (fStack_2b68.last_seqnum !=
        (long)*(int *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp + 1U) {
      pcStack_2bb0 = (code *)0x113b60;
      cb_inmem_snap();
    }
    pcStack_2bb0 = (code *)0x11394a;
    fVar5 = fdb_iterator_init(pfStack_2b98,&pfStack_2ba0,(void *)0x0,0,(void *)0x0,0,0);
    pfVar17 = (fdb_kvs_handle *)unaff_R13;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113c03;
    pcVar16 = auStack_2b28 + 0x100;
    pfVar22 = (fdb_kvs_handle *)auStack_2b28;
    uVar24 = 0;
    do {
      pfStack_2b90 = (fdb_kvs_handle *)0x0;
      pcStack_2bb0 = (code *)0x11397c;
      fVar5 = fdb_iterator_get(pfStack_2ba0,(fdb_doc **)&pfStack_2b90);
      unaff_R13 = (char *)pfStack_2b90;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      if ((int)uVar24 < *(int *)pcVar15) {
        lVar18 = CONCAT26(auStack_28e8._6_2_,CONCAT24(auStack_28e8._4_2_,auStack_28e8._0_4_));
        pcStack_2bb0 = (code *)0x1139a4;
        sprintf(pcVar16,*(char **)(lVar18 + 0x18),uVar24);
        sVar8 = (size_t)*(int *)(lVar18 + 0x10);
        pcStack_2bb0 = (code *)0x1139b8;
        memset(pfVar22,0x78,sVar8);
        *(undefined4 *)(auStack_2b38 + sVar8 + 10) = 0x646e653c;
        *(undefined2 *)((long)&uStack_2b2a + sVar8) = 0x3e;
        pcStack_2bb0 = (code *)0x1139dd;
        sprintf((char *)pfVar22,*(char **)(lVar18 + 0x20),uVar24);
        unaff_R13 = (char *)pfStack_2b90;
        __s_01 = (btree *)pfStack_2b90->op_stats;
        pcStack_2bb0 = (code *)0x1139f5;
        iVar6 = bcmp(__s_01,pcVar16,*(size_t *)&pfStack_2b90->kvs_config);
        if (iVar6 != 0) goto LAB_00113bb0;
        __s_01 = (((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pcStack_2bb0 = (code *)0x113a10;
        iVar6 = bcmp(__s_01,pfVar22,
                     (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_00113bc0;
      }
      else {
        auStack_2b28._256_4_ = 0x5f77656e;
        auStack_2b28[0x104] = 'k';
        auStack_2b28[0x105] = 'e';
        auStack_2b28[0x106] = 'y';
        auStack_2b28[0x107] = '\0';
        auStack_2b28[0] = 'n';
        auStack_2b28[1] = 'e';
        auStack_2b28._2_2_ = 0x5f77;
        auStack_2b28._4_4_ = 0x756c6176;
        auStack_2b28._8_2_ = 0x65;
        __s_01 = (btree *)pfStack_2b90->op_stats;
        pcStack_2bb0 = (code *)0x113a5f;
        iVar6 = bcmp(__s_01,pcVar16,*(size_t *)&pfStack_2b90->kvs_config);
        if (iVar6 != 0) goto LAB_00113bd0;
        __s_01 = (((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pcStack_2bb0 = (code *)0x113a7a;
        iVar6 = bcmp(__s_01,pfVar22,
                     (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_00113ba0;
      }
      uVar24 = (ulong)((int)uVar24 + 1);
      pcStack_2bb0 = (code *)0x113a8c;
      fdb_doc_free((fdb_doc *)unaff_R13);
      pcStack_2bb0 = (code *)0x113a96;
      fVar5 = fdb_iterator_next(pfStack_2ba0);
      pfVar17 = (fdb_kvs_handle *)unaff_R13;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)uVar24 != *(int *)pcVar15 + 1) {
      pcStack_2bb0 = (code *)0x113b7b;
      cb_inmem_snap();
    }
    pcStack_2bb0 = (code *)0x113ab4;
    fVar5 = fdb_iterator_close(pfStack_2ba0);
    pfVar14 = pfStack_2b88;
    pfVar12 = pfStack_2b98;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113c08;
    __s_01 = (btree *)(auStack_2b28 + 0x100);
    pcStack_2bb0 = (code *)0x113ad6;
    sVar8 = strlen((char *)__s_01);
    pcStack_2bb0 = (code *)0x113aef;
    fVar5 = fdb_get_kv(pfVar12,__s_01,sVar8 + 1,&pfStack_2b70,&sStack_2b78);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113c0d;
    pcStack_2bb0 = (code *)0x113b11;
    iVar6 = bcmp(pfStack_2b70,auStack_2b28,sStack_2b78);
    pfVar12 = pfStack_2b70;
    if (iVar6 == 0) {
      pcStack_2bb0 = (code *)0x113b21;
      fdb_free_block(pfStack_2b70);
LAB_00113b21:
      pcStack_2bb0 = (code *)0x113b2b;
      fdb_kvs_close(pfStack_2b98);
      return;
    }
  }
  pcStack_2bb0 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_3128 = (fdb_iterator *)0x113c42;
  fStack_2dd0.bub_ctx.space_used = (uint64_t)pfVar12;
  fStack_2dd0.bub_ctx.handle = pfVar22;
  pfStack_2bc8 = pfVar17;
  pbStack_2bc0 = __s_01;
  pfStack_2bb8 = pfVar14;
  pcStack_2bb0 = (code *)uVar24;
  gettimeofday(&tStack_2ff8,(__timezone_ptr_t)0x0);
  pfStack_3128 = (fdb_iterator *)0x113c47;
  memleak_start();
  pfStack_3128 = (fdb_iterator *)0x113c56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar13 = (fdb_kvs_handle *)&fStack_2dd0.config.encryption_key;
  pfStack_3128 = (fdb_iterator *)0x113c66;
  fdb_get_default_config();
  config_00 = (fdb_iterator *)auStack_2fe8;
  pfStack_3128 = (fdb_iterator *)0x113c76;
  fdb_get_default_kvs_config();
  fStack_2dd0.config.encryption_key.bytes[4] = '\0';
  fStack_2dd0.config.encryption_key.bytes[5] = '\0';
  fStack_2dd0.config.encryption_key.bytes[6] = '\0';
  fStack_2dd0.config.encryption_key.bytes[7] = '\0';
  fStack_2dd0.config.encryption_key.bytes[8] = '\0';
  fStack_2dd0.config.encryption_key.bytes[9] = '\0';
  fStack_2dd0.config.encryption_key.bytes[10] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0xb] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0xc] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0xd] = '\x04';
  fStack_2dd0.config.encryption_key.bytes[0xe] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0xf] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0x10] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0x11] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0x12] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0x13] = '\0';
  fStack_2dd0.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_2dd0.config._180_4_ = 1;
  fStack_2dd0.config.block_reusing_threshold._7_1_ = 0;
  pfStack_3128 = (fdb_iterator *)0x113ca0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar12 = (fdb_kvs_handle *)(auStack_3108 + 0x10);
  pfStack_3128 = (fdb_iterator *)0x113cb7;
  fVar5 = fdb_open((fdb_file_handle **)pfVar12,"./mvcc_test1",(fdb_config *)pfVar13);
  doc_01 = (fdb_iterator *)(ulong)(uint)fVar5;
  pfStack_3128 = (fdb_iterator *)0x113cc9;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_3108._16_8_,&pfStack_3118,(fdb_kvs_config *)config_00);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_3128 = (fdb_iterator *)0x113ce2;
    fVar5 = fdb_snapshot_open(pfStack_3118,(fdb_kvs_handle **)(auStack_3108 + 8),0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011469d;
    pfStack_3128 = (fdb_iterator *)0x113cfc;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_3108._8_8_,(fdb_kvs_info *)(apfStack_3058 + 6));
    if ((fdb_kvs_handle *)fStack_3028.last_seqnum != (fdb_kvs_handle *)0x0) {
      pfStack_3128 = (fdb_iterator *)0x113d0f;
      snapshot_clone_test();
    }
    pfVar12 = (fdb_kvs_handle *)auStack_3108;
    pfStack_3128 = (fdb_iterator *)0x113d32;
    fdb_iterator_init((fdb_kvs_handle *)auStack_3108._8_8_,(fdb_iterator **)pfVar12,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_3128 = (fdb_iterator *)0x113d3a;
    fVar5 = fdb_iterator_next((fdb_iterator *)auStack_3108._0_8_);
    pfVar14 = pfVar22;
    if (fVar5 != FDB_RESULT_ITERATOR_FAIL) goto LAB_001146a2;
    pfStack_3128 = (fdb_iterator *)0x113d4d;
    fdb_iterator_close((fdb_iterator *)auStack_3108._0_8_);
    pfStack_3128 = (fdb_iterator *)0x113d57;
    fdb_kvs_close((fdb_kvs_handle *)auStack_3108._8_8_);
    lVar18 = 0;
    uVar24 = 0;
    do {
      pfStack_3128 = (fdb_iterator *)0x113d79;
      sprintf(auStack_2fe8 + 0x18,"key%d",uVar24 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x113d95;
      sprintf((char *)&fStack_2ed0,"meta%d",uVar24 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x113db1;
      sprintf((char *)&fStack_2dd0,"body%d",uVar24 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x113dc1;
      sVar8 = strlen(auStack_2fe8 + 0x18);
      pfStack_3128 = (fdb_iterator *)0x113dcc;
      sVar9 = strlen((char *)&fStack_2ed0);
      pfStack_3128 = (fdb_iterator *)0x113dd7;
      sVar10 = strlen((char *)&fStack_2dd0);
      pfStack_3128 = (fdb_iterator *)0x113dfc;
      fdb_doc_create((fdb_doc **)(auStack_30d0 + lVar18),auStack_2fe8 + 0x18,sVar8,&fStack_2ed0,
                     sVar9,&fStack_2dd0,sVar10);
      pfStack_3128 = (fdb_iterator *)0x113e0b;
      fdb_set(pfStack_3118,*(fdb_doc **)(auStack_30d0 + uVar24 * 8));
      uVar24 = uVar24 + 1;
      lVar18 = lVar18 + 8;
    } while (uVar24 != 5);
    pfStack_3128 = (fdb_iterator *)0x113e2b;
    fdb_commit((fdb_file_handle *)auStack_3108._16_8_,'\x01');
    uVar24 = 5;
    ppfVar26 = (fdb_doc **)(auStack_30d0 + 0x28);
    do {
      pfStack_3128 = (fdb_iterator *)0x113e52;
      sprintf(auStack_2fe8 + 0x18,"key%d",uVar24 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x113e6e;
      sprintf((char *)&fStack_2ed0,"meta%d",uVar24 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x113e8a;
      sprintf((char *)&fStack_2dd0,"body%d",uVar24 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x113e92;
      sVar8 = strlen(auStack_2fe8 + 0x18);
      pfStack_3128 = (fdb_iterator *)0x113e9d;
      sVar9 = strlen((char *)&fStack_2ed0);
      pfStack_3128 = (fdb_iterator *)0x113ea8;
      sVar10 = strlen((char *)&fStack_2dd0);
      pfStack_3128 = (fdb_iterator *)0x113ec8;
      fdb_doc_create(ppfVar26,auStack_2fe8 + 0x18,sVar8,&fStack_2ed0,sVar9,&fStack_2dd0,sVar10);
      pfStack_3128 = (fdb_iterator *)0x113ed5;
      fdb_set(pfStack_3118,*ppfVar26);
      uVar24 = uVar24 + 1;
      ppfVar26 = ppfVar26 + 1;
    } while (uVar24 != 9);
    pfVar13 = (fdb_kvs_handle *)(auStack_2fe8 + 0x18);
    pfStack_3128 = (fdb_iterator *)0x113f04;
    sprintf((char *)pfVar13,"key%d",9);
    config_00 = &fStack_2ed0;
    pfStack_3128 = (fdb_iterator *)0x113f22;
    sprintf((char *)config_00,"meta%d",9);
    pfVar14 = &fStack_2dd0;
    pfStack_3128 = (fdb_iterator *)0x113f40;
    sprintf((char *)pfVar14,"Body%d",9);
    pfVar12 = (fdb_kvs_handle *)(auStack_30d0 + 0x48);
    pfStack_3128 = (fdb_iterator *)0x113f50;
    pfVar17 = (fdb_kvs_handle *)strlen((char *)pfVar13);
    pfStack_3128 = (fdb_iterator *)0x113f5b;
    doc_01 = (fdb_iterator *)strlen((char *)config_00);
    pfStack_3128 = (fdb_iterator *)0x113f66;
    sVar8 = strlen((char *)pfVar14);
    pfStack_3128 = (fdb_iterator *)0x113f81;
    fdb_doc_create((fdb_doc **)pfVar12,pfVar13,(size_t)pfVar17,config_00,(size_t)doc_01,pfVar14,
                   sVar8);
    pfStack_3128 = (fdb_iterator *)0x113f8e;
    fdb_set(pfStack_3118,(fdb_doc *)auStack_30d0._72_8_);
    pfStack_3128 = (fdb_iterator *)0x113f9a;
    fdb_commit((fdb_file_handle *)auStack_3108._16_8_,'\0');
    **(undefined1 **)(auStack_30d0._72_8_ + 0x40) = 0x62;
    pfStack_3128 = (fdb_iterator *)0x113fb1;
    fdb_set(pfStack_3118,(fdb_doc *)auStack_30d0._72_8_);
    pfStack_3128 = (fdb_iterator *)0x113fbd;
    fdb_commit((fdb_file_handle *)auStack_3108._16_8_,'\0');
    pfStack_30e8 = *(fdb_kvs_handle **)(auStack_30d0._72_8_ + 0x28);
    pfStack_3128 = (fdb_iterator *)0x113fdf;
    fVar5 = fdb_snapshot_open(pfStack_3118,&pfStack_30d8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146a7;
    pfStack_3128 = (fdb_iterator *)0x113ff9;
    fdb_set(pfStack_3118,(fdb_doc *)auStack_30d0._72_8_);
    pfStack_3128 = (fdb_iterator *)0x114005;
    fdb_commit((fdb_file_handle *)auStack_3108._16_8_,'\0');
    uVar24 = 10;
    pfVar12 = (fdb_kvs_handle *)0x50;
    do {
      pfStack_3128 = (fdb_iterator *)0x11402c;
      sprintf(auStack_2fe8 + 0x18,"key%d",uVar24 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x114048;
      sprintf((char *)&fStack_2ed0,"meta%d",uVar24 & 0xffffffff);
      pfVar14 = &fStack_2dd0;
      pfStack_3128 = (fdb_iterator *)0x114064;
      sprintf((char *)pfVar14,"body%d",uVar24 & 0xffffffff);
      doc_01 = (fdb_iterator *)(auStack_30d0 + (long)pfVar12);
      pfStack_3128 = (fdb_iterator *)0x114074;
      pfVar13 = (fdb_kvs_handle *)strlen(auStack_2fe8 + 0x18);
      pfStack_3128 = (fdb_iterator *)0x11407f;
      pfVar17 = (fdb_kvs_handle *)strlen((char *)&fStack_2ed0);
      pfStack_3128 = (fdb_iterator *)0x11408a;
      sVar8 = strlen((char *)pfVar14);
      pfStack_3128 = (fdb_iterator *)0x1140af;
      fdb_doc_create((fdb_doc **)doc_01,auStack_2fe8 + 0x18,(size_t)pfVar13,&fStack_2ed0,
                     (size_t)pfVar17,pfVar14,sVar8);
      pfStack_3128 = (fdb_iterator *)0x1140be;
      fdb_set(pfStack_3118,*(fdb_doc **)(auStack_30d0 + uVar24 * 8));
      uVar24 = uVar24 + 1;
      pfVar12 = (fdb_kvs_handle *)((long)pfVar12 + 8);
    } while (uVar24 != 0xf);
    pfStack_3128 = (fdb_iterator *)0x1140de;
    fdb_commit((fdb_file_handle *)auStack_3108._16_8_,'\x01');
    pfStack_3128 = (fdb_iterator *)0x1140f6;
    fVar5 = fdb_set_log_callback(pfStack_3118,logCallbackFunc,"snapshot_clone_test");
    config_00 = (fdb_iterator *)0xf;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146ac;
    pfStack_3128 = (fdb_iterator *)0x114112;
    fVar5 = fdb_snapshot_open(pfStack_3118,(fdb_kvs_handle **)(auStack_3108 + 8),999999);
    pfVar13 = pfStack_30e8;
    if (fVar5 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001146b1;
    pfStack_3128 = (fdb_iterator *)0x114132;
    fVar5 = fdb_snapshot_open(pfStack_3118,(fdb_kvs_handle **)(auStack_3108 + 8),
                              (fdb_seqnum_t)pfStack_30e8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146b6;
    pfStack_3128 = (fdb_iterator *)0x11414c;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_3108._8_8_,&pfStack_30f0,
                              (fdb_seqnum_t)pfVar13);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146bb;
    pfStack_3128 = (fdb_iterator *)0x11415e;
    fVar5 = fdb_kvs_close((fdb_kvs_handle *)auStack_3108._8_8_);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146c0;
    pfStack_3128 = (fdb_iterator *)0x11417b;
    fdb_get_kvs_info(pfStack_30f0,(fdb_kvs_info *)(apfStack_3058 + 6));
    if ((fdb_kvs_handle *)fStack_3028.last_seqnum != pfVar13) {
      pfStack_3128 = (fdb_iterator *)0x114191;
      snapshot_clone_test();
    }
    uVar24 = 0xf;
    config_00 = (fdb_iterator *)apfStack_3058;
    do {
      pfStack_3128 = (fdb_iterator *)0x1141b9;
      sprintf(auStack_2fe8 + 0x18,"key%d",uVar24 & 0xffffffff);
      doc_01 = &fStack_2ed0;
      pfStack_3128 = (fdb_iterator *)0x1141d4;
      sprintf((char *)doc_01,"meta%d",uVar24 & 0xffffffff);
      pfVar13 = &fStack_2dd0;
      pfStack_3128 = (fdb_iterator *)0x1141ef;
      sprintf((char *)pfVar13,"body%d",uVar24 & 0xffffffff);
      pfStack_3128 = (fdb_iterator *)0x1141f7;
      pfVar14 = (fdb_kvs_handle *)strlen(auStack_2fe8 + 0x18);
      pfStack_3128 = (fdb_iterator *)0x114202;
      pfVar17 = (fdb_kvs_handle *)strlen((char *)doc_01);
      pfStack_3128 = (fdb_iterator *)0x11420d;
      sVar8 = strlen((char *)pfVar13);
      pfStack_3128 = (fdb_iterator *)0x11422d;
      fdb_doc_create((fdb_doc **)config_00,auStack_2fe8 + 0x18,(size_t)pfVar14,doc_01,
                     (size_t)pfVar17,pfVar13,sVar8);
      pfStack_3128 = (fdb_iterator *)0x11423a;
      fdb_set(pfStack_3118,*(fdb_doc **)config_00);
      uVar24 = uVar24 + 1;
      config_00 = (fdb_iterator *)((long)config_00 + 8);
    } while (uVar24 != 0x14);
    pfStack_3128 = (fdb_iterator *)0x114257;
    fdb_commit((fdb_file_handle *)auStack_3108._16_8_,'\0');
    pfStack_3128 = (fdb_iterator *)0x11426d;
    fVar5 = fdb_snapshot_open(pfStack_30d8,&pfStack_30e0,0xffffffffffffffff);
    pfVar12 = (fdb_kvs_handle *)0x14;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146c5;
    pfVar12 = (fdb_kvs_handle *)&pfStack_3110;
    pfStack_3128 = (fdb_iterator *)0x1142b8;
    fdb_doc_create((fdb_doc **)pfVar12,
                   (void *)(*(size_t **)
                             (auStack_30d0 + (((long)pfStack_30e8 << 0x20) + 0x100000000 >> 0x1d)))
                           [4],
                   **(size_t **)
                     (auStack_30d0 + (((long)pfStack_30e8 << 0x20) + 0x100000000 >> 0x1d)),
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_3128 = (fdb_iterator *)0x1142c5;
    fVar5 = fdb_get_metaonly(pfStack_30f0,(fdb_doc *)pfStack_3110);
    if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001146ca;
    pfStack_3128 = (fdb_iterator *)0x1142db;
    fdb_doc_free((fdb_doc *)pfStack_3110);
    pfStack_3128 = (fdb_iterator *)0x1142ff;
    fdb_doc_create((fdb_doc **)&pfStack_3110,
                   (void *)(((atomic<unsigned_long> *)(auStack_30d0._40_8_ + 0x20))->
                           super___atomic_base<unsigned_long>)._M_i,
                   (__int_type)
                   *(__atomic_base<unsigned_long> *)(fdb_kvs_config *)auStack_30d0._40_8_,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_3128 = (fdb_iterator *)0x11430c;
    fVar5 = fdb_get_metaonly(pfStack_30f0,(fdb_doc *)pfStack_3110);
    pfVar22 = (fdb_kvs_handle *)auStack_30d0._40_8_;
    doc_02 = pfStack_3110;
    pfVar12 = (fdb_kvs_handle *)&pfStack_3110;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146cf;
    pfVar13 = (fdb_kvs_handle *)pfStack_3110->op_stats;
    config_00 = (fdb_iterator *)
                (((atomic<unsigned_long> *)(auStack_30d0._40_8_ + 0x20))->
                super___atomic_base<unsigned_long>)._M_i;
    pfStack_3128 = (fdb_iterator *)0x114336;
    iVar6 = bcmp(pfVar13,config_00,
                 (__int_type)*(__atomic_base<unsigned_long> *)(fdb_kvs_config *)auStack_30d0._40_8_)
    ;
    if (iVar6 != 0) goto LAB_001146d4;
    pfVar13 = (fdb_kvs_handle *)doc_02->staletree;
    config_00 = *(fdb_iterator **)((long)pfVar22 + 0x38);
    pfStack_3128 = (fdb_iterator *)0x114357;
    iVar6 = bcmp(pfVar13,config_00,
                 (size_t)(((atomic<unsigned_long> *)&(pfVar22->kvs_config).custom_cmp)->
                         super___atomic_base<unsigned_long>)._M_i);
    if (iVar6 != 0) goto LAB_001146df;
    pfStack_3128 = (fdb_iterator *)0x114367;
    fdb_doc_free((fdb_doc *)doc_02);
    pfStack_3128 = (fdb_iterator *)0x114388;
    fdb_doc_create((fdb_doc **)&pfStack_3110,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_3110->fhandle = (fdb_file_handle *)0x6;
    pfStack_3128 = (fdb_iterator *)0x11439d;
    fVar5 = fdb_get_byseq(pfStack_30f0,(fdb_doc *)pfStack_3110);
    pfVar12 = pfStack_3110;
    doc_02 = (fdb_kvs_handle *)&pfStack_3110;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146ea;
    pfVar13 = (fdb_kvs_handle *)pfStack_3110->op_stats;
    config_00 = (fdb_iterator *)
                (((atomic<unsigned_long> *)(auStack_30d0._40_8_ + 0x20))->
                super___atomic_base<unsigned_long>)._M_i;
    pfStack_3128 = (fdb_iterator *)0x1143c6;
    iVar6 = bcmp(pfVar13,config_00,*(size_t *)&pfStack_3110->kvs_config);
    pfVar22 = (fdb_kvs_handle *)auStack_30d0._40_8_;
    if (iVar6 != 0) goto LAB_001146ef;
    pfVar13 = (fdb_kvs_handle *)(pfVar12->field_6).seqtree;
    config_00 = (fdb_iterator *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_30d0._40_8_ + 0x40))->
                seqtree;
    pfStack_3128 = (fdb_iterator *)0x1143e6;
    iVar6 = bcmp(pfVar13,config_00,(size_t)(pfVar12->kvs_config).custom_cmp_param);
    if (iVar6 != 0) goto LAB_001146fa;
    pfStack_3128 = (fdb_iterator *)0x1143f6;
    fdb_doc_free((fdb_doc *)pfVar12);
    pfVar12 = (fdb_kvs_handle *)&pfStack_3110;
    pfStack_3110 = (fdb_kvs_handle *)0x0;
    pfVar17 = (fdb_kvs_handle *)0x0;
    pfStack_3128 = (fdb_iterator *)0x114425;
    fdb_iterator_init(pfStack_30f0,(fdb_iterator **)auStack_3108,(void *)0x0,0,(void *)0x0,0,0);
    pfVar14 = pfVar13;
    do {
      pfStack_3128 = (fdb_iterator *)0x114432;
      fVar5 = fdb_iterator_get((fdb_iterator *)auStack_3108._0_8_,(fdb_doc **)pfVar12);
      pfVar13 = pfStack_3110;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00114657:
        pfStack_3128 = (fdb_iterator *)0x11465c;
        snapshot_clone_test();
        pfVar13 = pfVar14;
LAB_0011465c:
        pfStack_3128 = (fdb_iterator *)0x114667;
        snapshot_clone_test();
LAB_00114667:
        pfStack_3128 = (fdb_iterator *)0x114672;
        snapshot_clone_test();
        goto LAB_00114672;
      }
      config_00 = (fdb_iterator *)pfStack_3110->op_stats;
      doc_01 = *(fdb_iterator **)(auStack_30d0 + (long)pfVar17 * 8);
      pfVar22 = (fdb_kvs_handle *)doc_01->_seqnum;
      pfStack_3128 = (fdb_iterator *)0x11445a;
      iVar6 = bcmp(config_00,pfVar22,*(size_t *)&pfStack_3110->kvs_config);
      pfVar14 = pfVar13;
      if (iVar6 != 0) {
        pfStack_3128 = (fdb_iterator *)0x114657;
        snapshot_clone_test();
        goto LAB_00114657;
      }
      config_00 = (fdb_iterator *)pfVar13->staletree;
      pfVar22 = (fdb_kvs_handle *)doc_01->tree_cursor_start;
      pfStack_3128 = (fdb_iterator *)0x114479;
      iVar6 = bcmp(config_00,pfVar22,(size_t)(pfVar13->kvs_config).custom_cmp);
      if (iVar6 != 0) goto LAB_00114667;
      config_00 = (fdb_iterator *)(pfVar13->field_6).seqtree;
      pfVar22 = (fdb_kvs_handle *)doc_01->tree_cursor_prev;
      pfStack_3128 = (fdb_iterator *)0x114498;
      iVar6 = bcmp(config_00,pfVar22,(size_t)(pfVar13->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_0011465c;
      pfStack_3128 = (fdb_iterator *)0x1144a8;
      fdb_doc_free((fdb_doc *)pfVar13);
      pfStack_3110 = (fdb_kvs_handle *)0x0;
      pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
      pfStack_3128 = (fdb_iterator *)0x1144be;
      pfVar23 = (fdb_iterator *)auStack_3108._0_8_;
      fVar5 = fdb_iterator_next((fdb_iterator *)auStack_3108._0_8_);
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)pfVar17 == 10) {
      pfStack_3128 = (fdb_iterator *)0x1144dd;
      fdb_iterator_close((fdb_iterator *)auStack_3108._0_8_);
      pfVar17 = (fdb_kvs_handle *)0x0;
      pfStack_3128 = (fdb_iterator *)0x1144fe;
      fdb_iterator_init(pfStack_30e0,(fdb_iterator **)auStack_3108,(void *)0x0,0,(void *)0x0,0,0);
      pfVar12 = (fdb_kvs_handle *)&pfStack_3110;
      do {
        pfStack_3128 = (fdb_iterator *)0x114510;
        fVar5 = fdb_iterator_get((fdb_iterator *)auStack_3108._0_8_,(fdb_doc **)pfVar12);
        pfVar13 = pfStack_3110;
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011467d;
        config_00 = (fdb_iterator *)pfStack_3110->op_stats;
        doc_01 = *(fdb_iterator **)(auStack_30d0 + (long)pfVar17 * 8);
        pfVar22 = (fdb_kvs_handle *)doc_01->_seqnum;
        pfStack_3128 = (fdb_iterator *)0x114538;
        iVar6 = bcmp(config_00,pfVar22,*(size_t *)&pfStack_3110->kvs_config);
        if (iVar6 != 0) goto LAB_00114672;
        config_00 = (fdb_iterator *)pfVar13->staletree;
        pfVar22 = (fdb_kvs_handle *)doc_01->tree_cursor_start;
        pfStack_3128 = (fdb_iterator *)0x114557;
        iVar6 = bcmp(config_00,pfVar22,(size_t)(pfVar13->kvs_config).custom_cmp);
        if (iVar6 != 0) goto LAB_0011468d;
        config_00 = (fdb_iterator *)(pfVar13->field_6).seqtree;
        pfVar22 = (fdb_kvs_handle *)doc_01->tree_cursor_prev;
        pfStack_3128 = (fdb_iterator *)0x114576;
        iVar6 = bcmp(config_00,pfVar22,(size_t)(pfVar13->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_00114682;
        pfStack_3128 = (fdb_iterator *)0x114586;
        fdb_doc_free((fdb_doc *)pfVar13);
        pfStack_3110 = (fdb_kvs_handle *)0x0;
        pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
        pfStack_3128 = (fdb_iterator *)0x11459c;
        pfVar23 = (fdb_iterator *)auStack_3108._0_8_;
        fVar5 = fdb_iterator_next((fdb_iterator *)auStack_3108._0_8_);
        pfVar14 = pfVar13;
      } while (fVar5 == FDB_RESULT_SUCCESS);
      if ((int)pfVar17 == 10) {
        pfStack_3128 = (fdb_iterator *)0x1145b8;
        fdb_iterator_close((fdb_iterator *)auStack_3108._0_8_);
        pfStack_3128 = (fdb_iterator *)0x1145c2;
        fdb_kvs_close(pfStack_3118);
        pfStack_3128 = (fdb_iterator *)0x1145cc;
        fdb_kvs_close(pfStack_30d8);
        pfStack_3128 = (fdb_iterator *)0x1145d6;
        fdb_kvs_close(pfStack_30e0);
        pfStack_3128 = (fdb_iterator *)0x1145e0;
        fdb_kvs_close(pfStack_30f0);
        pfStack_3128 = (fdb_iterator *)0x1145ea;
        fdb_close((fdb_file_handle *)auStack_3108._16_8_);
        lVar18 = 0;
        do {
          pfStack_3128 = (fdb_iterator *)0x1145f6;
          fdb_doc_free(*(fdb_doc **)(auStack_30d0 + lVar18 * 8));
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x14);
        pfStack_3128 = (fdb_iterator *)0x114604;
        fdb_shutdown();
        pfStack_3128 = (fdb_iterator *)0x114609;
        memleak_end();
        pcVar15 = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          pcVar15 = "%s FAILED\n";
        }
        pfStack_3128 = (fdb_iterator *)0x11463a;
        fprintf(_stderr,pcVar15,"snapshot clone test");
        return;
      }
      goto LAB_0011470a;
    }
  }
  else {
LAB_00114698:
    pfStack_3128 = (fdb_iterator *)0x11469d;
    snapshot_clone_test();
LAB_0011469d:
    pfStack_3128 = (fdb_iterator *)0x1146a2;
    snapshot_clone_test();
    pfVar14 = pfVar22;
LAB_001146a2:
    pfStack_3128 = (fdb_iterator *)0x1146a7;
    snapshot_clone_test();
LAB_001146a7:
    pfStack_3128 = (fdb_iterator *)0x1146ac;
    snapshot_clone_test();
LAB_001146ac:
    pfStack_3128 = (fdb_iterator *)0x1146b1;
    snapshot_clone_test();
LAB_001146b1:
    pfStack_3128 = (fdb_iterator *)0x1146b6;
    snapshot_clone_test();
LAB_001146b6:
    pfStack_3128 = (fdb_iterator *)0x1146bb;
    snapshot_clone_test();
LAB_001146bb:
    pfStack_3128 = (fdb_iterator *)0x1146c0;
    snapshot_clone_test();
LAB_001146c0:
    pfStack_3128 = (fdb_iterator *)0x1146c5;
    snapshot_clone_test();
LAB_001146c5:
    pfStack_3128 = (fdb_iterator *)0x1146ca;
    snapshot_clone_test();
LAB_001146ca:
    pfStack_3128 = (fdb_iterator *)0x1146cf;
    snapshot_clone_test();
LAB_001146cf:
    pfVar22 = pfVar14;
    doc_02 = pfVar12;
    pfStack_3128 = (fdb_iterator *)0x1146d4;
    snapshot_clone_test();
LAB_001146d4:
    pfStack_3128 = (fdb_iterator *)0x1146df;
    snapshot_clone_test();
LAB_001146df:
    pfStack_3128 = (fdb_iterator *)0x1146ea;
    snapshot_clone_test();
LAB_001146ea:
    pfVar12 = doc_02;
    pfStack_3128 = (fdb_iterator *)0x1146ef;
    snapshot_clone_test();
LAB_001146ef:
    pfStack_3128 = (fdb_iterator *)0x1146fa;
    snapshot_clone_test();
LAB_001146fa:
    pfStack_3128 = (fdb_iterator *)0x114705;
    pfVar23 = config_00;
    snapshot_clone_test();
  }
  pfStack_3128 = (fdb_iterator *)0x11470a;
  snapshot_clone_test();
LAB_0011470a:
  pfStack_3128 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_3180 = (fdb_doc *)0x0;
  pfVar14 = pfVar23->handle;
  iVar6 = *(int *)&pfVar23->seqtree_iterator;
  pfStack_3150 = pfVar12;
  pfStack_3148 = pfVar22;
  pfStack_3140 = pfVar17;
  pfStack_3138 = pfVar13;
  pfStack_3130 = config_00;
  pfStack_3128 = doc_01;
  gettimeofday(&tStack_3160,(__timezone_ptr_t)0x0);
  fVar5 = fdb_snapshot_open((fdb_kvs_handle *)pfVar23->hbtrie_iterator,&pfStack_3168,
                            0xffffffffffffffff);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar18 = 0;
  iStack_316c = iVar6;
  fdb_iterator_init(pfStack_3168,&pfStack_3178,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar5 = fdb_iterator_get(pfStack_3178,&pfStack_3180);
    pfVar25 = pfStack_3180;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfStack_3180->key;
    lVar2 = *(long *)(&(pfVar14->kvs_config).create_if_missing + lVar18 * 8);
    pvVar3 = *(void **)(lVar2 + 0x20);
    iVar6 = bcmp(pvVar1,pvVar3,pfStack_3180->keylen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfVar25->body;
    pvVar3 = *(void **)(lVar2 + 0x40);
    iVar6 = bcmp(pvVar1,pvVar3,pfVar25->bodylen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(pfVar25);
    pfStack_3180 = (fdb_doc *)0x0;
    lVar18 = lVar18 + 1;
    fVar5 = fdb_iterator_next(pfStack_3178);
  } while (fVar5 == FDB_RESULT_SUCCESS);
  if (iStack_316c / 2 == (int)lVar18) {
    fdb_iterator_close(pfStack_3178);
    fdb_kvs_close(pfStack_3168);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x7e9);
  __assert_fail("count==n/2",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x7e9,"void *snap_clone_thread(void *)");
}

Assistant:

void rollback_secondary_kvs()
{
    TEST_INIT();
    memleak_start();

    int r;
    void *value_out;
    size_t valuelen_out;

    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_file_handle *dbfile;
    fdb_kvs_handle *kv1, *kv2;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &kv1, &kvs_config);
    fdb_kvs_open_default(dbfile, &kv2, &kvs_config);

    // seq:2
    status = fdb_set_kv(kv1, (void *) "a", 1, (void *)"val-a", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_kv(kv1, (void *) "b", 1, (void *)"val-b", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // seq:3
    status = fdb_set_kv(kv1, (void *) "b", 1, (void *)"val-v", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // seq:4
    status = fdb_del_kv(kv1, (void *)"a", 1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // get 'a' via kv2
    status = fdb_get_kv(kv2, (void *)"b", 1, &value_out, &valuelen_out);
    free(value_out);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // rollback seq:3 via kv2
    status = fdb_rollback(&kv2, 3);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("rollback secondary kv");
}